

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  code *pcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined8 uVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  long lVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  undefined1 auVar91 [32];
  byte bVar92;
  ulong uVar93;
  uint uVar94;
  uint uVar95;
  ulong uVar96;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar104;
  undefined1 auVar113 [16];
  long lVar97;
  uint uVar98;
  ulong uVar99;
  size_t sVar100;
  byte bVar101;
  ulong uVar102;
  float fVar103;
  float fVar157;
  float fVar159;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar110 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar111 [16];
  float fVar158;
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar112 [16];
  float fVar161;
  float fVar164;
  float fVar165;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar166;
  undefined4 uVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar181 [64];
  undefined8 uVar187;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar190;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar201;
  float fVar207;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [64];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined4 local_880;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [16];
  size_t local_7f0;
  undefined1 (*local_7e8) [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [64];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  int local_59c;
  undefined1 local_590 [16];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  float local_540 [4];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar236 [32];
  
  PVar8 = prim[1];
  uVar102 = (ulong)(byte)PVar8;
  lVar77 = uVar102 * 0x19;
  fVar201 = *(float *)(prim + lVar77 + 0x12);
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar105 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar29 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar191 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar192 = vsubps_avx(auVar105,*(undefined1 (*) [16])(prim + lVar77 + 6));
  fVar200 = fVar201 * auVar192._0_4_;
  fVar166 = fVar201 * auVar191._0_4_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar102 * 4 + 6);
  auVar119 = vpmovsxbd_avx2(auVar105);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar102 * 5 + 6);
  auVar117 = vpmovsxbd_avx2(auVar29);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar102 * 6 + 6);
  auVar129 = vpmovsxbd_avx2(auVar6);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar102 * 0xb + 6);
  auVar128 = vpmovsxbd_avx2(auVar113);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar122 = vpmovsxbd_avx2(auVar108);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar120 = vcvtdq2ps_avx(auVar122);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar102 + 6);
  auVar118 = vpmovsxbd_avx2(auVar109);
  auVar118 = vcvtdq2ps_avx(auVar118);
  uVar99 = (ulong)(uint)((int)(uVar102 * 9) * 2);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar127 = vpmovsxbd_avx2(auVar107);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar99 + uVar102 + 6);
  auVar126 = vpmovsxbd_avx2(auVar106);
  auVar126 = vcvtdq2ps_avx(auVar126);
  uVar93 = (ulong)(uint)((int)(uVar102 * 5) << 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar93 + 6);
  auVar116 = vpmovsxbd_avx2(auVar7);
  auVar121 = vcvtdq2ps_avx(auVar116);
  auVar232._4_4_ = fVar166;
  auVar232._0_4_ = fVar166;
  auVar232._8_4_ = fVar166;
  auVar232._12_4_ = fVar166;
  auVar232._16_4_ = fVar166;
  auVar232._20_4_ = fVar166;
  auVar232._24_4_ = fVar166;
  auVar232._28_4_ = fVar166;
  auVar234._8_4_ = 1;
  auVar234._0_8_ = 0x100000001;
  auVar234._12_4_ = 1;
  auVar234._16_4_ = 1;
  auVar234._20_4_ = 1;
  auVar234._24_4_ = 1;
  auVar234._28_4_ = 1;
  auVar114 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar241 = ZEXT3264(auVar114);
  auVar124 = ZEXT1632(CONCAT412(fVar201 * auVar191._12_4_,
                                CONCAT48(fVar201 * auVar191._8_4_,
                                         CONCAT44(fVar201 * auVar191._4_4_,fVar166))));
  auVar123 = vpermps_avx2(auVar234,auVar124);
  auVar115 = vpermps_avx512vl(auVar114,auVar124);
  fVar166 = auVar115._0_4_;
  fVar182 = auVar115._4_4_;
  auVar124._4_4_ = fVar182 * auVar129._4_4_;
  auVar124._0_4_ = fVar166 * auVar129._0_4_;
  fVar183 = auVar115._8_4_;
  auVar124._8_4_ = fVar183 * auVar129._8_4_;
  fVar190 = auVar115._12_4_;
  auVar124._12_4_ = fVar190 * auVar129._12_4_;
  fVar184 = auVar115._16_4_;
  auVar124._16_4_ = fVar184 * auVar129._16_4_;
  fVar185 = auVar115._20_4_;
  auVar124._20_4_ = fVar185 * auVar129._20_4_;
  fVar186 = auVar115._24_4_;
  auVar124._24_4_ = fVar186 * auVar129._24_4_;
  auVar124._28_4_ = auVar122._28_4_;
  auVar122._4_4_ = auVar118._4_4_ * fVar182;
  auVar122._0_4_ = auVar118._0_4_ * fVar166;
  auVar122._8_4_ = auVar118._8_4_ * fVar183;
  auVar122._12_4_ = auVar118._12_4_ * fVar190;
  auVar122._16_4_ = auVar118._16_4_ * fVar184;
  auVar122._20_4_ = auVar118._20_4_ * fVar185;
  auVar122._24_4_ = auVar118._24_4_ * fVar186;
  auVar122._28_4_ = auVar116._28_4_;
  auVar116._4_4_ = auVar121._4_4_ * fVar182;
  auVar116._0_4_ = auVar121._0_4_ * fVar166;
  auVar116._8_4_ = auVar121._8_4_ * fVar183;
  auVar116._12_4_ = auVar121._12_4_ * fVar190;
  auVar116._16_4_ = auVar121._16_4_ * fVar184;
  auVar116._20_4_ = auVar121._20_4_ * fVar185;
  auVar116._24_4_ = auVar121._24_4_ * fVar186;
  auVar116._28_4_ = auVar115._28_4_;
  auVar105 = vfmadd231ps_fma(auVar124,auVar123,auVar117);
  auVar29 = vfmadd231ps_fma(auVar122,auVar123,auVar120);
  auVar6 = vfmadd231ps_fma(auVar116,auVar126,auVar123);
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar232,auVar119);
  auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar232,auVar128);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar127,auVar232);
  auVar233._4_4_ = fVar200;
  auVar233._0_4_ = fVar200;
  auVar233._8_4_ = fVar200;
  auVar233._12_4_ = fVar200;
  auVar233._16_4_ = fVar200;
  auVar233._20_4_ = fVar200;
  auVar233._24_4_ = fVar200;
  auVar233._28_4_ = fVar200;
  auVar116 = ZEXT1632(CONCAT412(fVar201 * auVar192._12_4_,
                                CONCAT48(fVar201 * auVar192._8_4_,
                                         CONCAT44(fVar201 * auVar192._4_4_,fVar200))));
  auVar122 = vpermps_avx2(auVar234,auVar116);
  auVar116 = vpermps_avx512vl(auVar114,auVar116);
  fVar201 = auVar116._0_4_;
  fVar166 = auVar116._4_4_;
  auVar123._4_4_ = fVar166 * auVar129._4_4_;
  auVar123._0_4_ = fVar201 * auVar129._0_4_;
  fVar182 = auVar116._8_4_;
  auVar123._8_4_ = fVar182 * auVar129._8_4_;
  fVar183 = auVar116._12_4_;
  auVar123._12_4_ = fVar183 * auVar129._12_4_;
  fVar190 = auVar116._16_4_;
  auVar123._16_4_ = fVar190 * auVar129._16_4_;
  fVar184 = auVar116._20_4_;
  auVar123._20_4_ = fVar184 * auVar129._20_4_;
  fVar185 = auVar116._24_4_;
  auVar123._24_4_ = fVar185 * auVar129._24_4_;
  auVar123._28_4_ = 1;
  auVar114._4_4_ = auVar118._4_4_ * fVar166;
  auVar114._0_4_ = auVar118._0_4_ * fVar201;
  auVar114._8_4_ = auVar118._8_4_ * fVar182;
  auVar114._12_4_ = auVar118._12_4_ * fVar183;
  auVar114._16_4_ = auVar118._16_4_ * fVar190;
  auVar114._20_4_ = auVar118._20_4_ * fVar184;
  auVar114._24_4_ = auVar118._24_4_ * fVar185;
  auVar114._28_4_ = auVar129._28_4_;
  auVar118._4_4_ = auVar121._4_4_ * fVar166;
  auVar118._0_4_ = auVar121._0_4_ * fVar201;
  auVar118._8_4_ = auVar121._8_4_ * fVar182;
  auVar118._12_4_ = auVar121._12_4_ * fVar183;
  auVar118._16_4_ = auVar121._16_4_ * fVar190;
  auVar118._20_4_ = auVar121._20_4_ * fVar184;
  auVar118._24_4_ = auVar121._24_4_ * fVar185;
  auVar118._28_4_ = auVar116._28_4_;
  auVar113 = vfmadd231ps_fma(auVar123,auVar122,auVar117);
  auVar108 = vfmadd231ps_fma(auVar114,auVar122,auVar120);
  auVar109 = vfmadd231ps_fma(auVar118,auVar122,auVar126);
  auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar233,auVar119);
  auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar233,auVar128);
  auVar224._8_4_ = 0x7fffffff;
  auVar224._0_8_ = 0x7fffffff7fffffff;
  auVar224._12_4_ = 0x7fffffff;
  auVar224._16_4_ = 0x7fffffff;
  auVar224._20_4_ = 0x7fffffff;
  auVar224._24_4_ = 0x7fffffff;
  auVar224._28_4_ = 0x7fffffff;
  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar233,auVar127);
  auVar119 = vandps_avx(ZEXT1632(auVar105),auVar224);
  auVar222._8_4_ = 0x219392ef;
  auVar222._0_8_ = 0x219392ef219392ef;
  auVar222._12_4_ = 0x219392ef;
  auVar222._16_4_ = 0x219392ef;
  auVar222._20_4_ = 0x219392ef;
  auVar222._24_4_ = 0x219392ef;
  auVar222._28_4_ = 0x219392ef;
  uVar99 = vcmpps_avx512vl(auVar119,auVar222,1);
  bVar14 = (bool)((byte)uVar99 & 1);
  auVar115._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._0_4_;
  bVar14 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._4_4_;
  bVar14 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._8_4_;
  bVar14 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar105._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar119 = vandps_avx(ZEXT1632(auVar29),auVar224);
  uVar99 = vcmpps_avx512vl(auVar119,auVar222,1);
  bVar14 = (bool)((byte)uVar99 & 1);
  auVar125._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._0_4_;
  bVar14 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar125._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._4_4_;
  bVar14 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar125._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._8_4_;
  bVar14 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar125._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._12_4_;
  auVar125._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar125._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar125._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar125._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar119 = vandps_avx(ZEXT1632(auVar6),auVar224);
  uVar99 = vcmpps_avx512vl(auVar119,auVar222,1);
  bVar14 = (bool)((byte)uVar99 & 1);
  auVar119._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar6._0_4_;
  bVar14 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar6._4_4_;
  bVar14 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar6._8_4_;
  bVar14 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar6._12_4_;
  auVar119._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar119._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar119._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar119._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar117 = vrcp14ps_avx512vl(auVar115);
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = 0x3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar223._16_4_ = 0x3f800000;
  auVar223._20_4_ = 0x3f800000;
  auVar223._24_4_ = 0x3f800000;
  auVar223._28_4_ = 0x3f800000;
  auVar105 = vfnmadd213ps_fma(auVar115,auVar117,auVar223);
  auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar117,auVar117);
  auVar117 = vrcp14ps_avx512vl(auVar125);
  auVar29 = vfnmadd213ps_fma(auVar125,auVar117,auVar223);
  auVar29 = vfmadd132ps_fma(ZEXT1632(auVar29),auVar117,auVar117);
  auVar117 = vrcp14ps_avx512vl(auVar119);
  auVar6 = vfnmadd213ps_fma(auVar119,auVar117,auVar223);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar117,auVar117);
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 7 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar113));
  auVar127._4_4_ = auVar105._4_4_ * auVar119._4_4_;
  auVar127._0_4_ = auVar105._0_4_ * auVar119._0_4_;
  auVar127._8_4_ = auVar105._8_4_ * auVar119._8_4_;
  auVar127._12_4_ = auVar105._12_4_ * auVar119._12_4_;
  auVar127._16_4_ = auVar119._16_4_ * 0.0;
  auVar127._20_4_ = auVar119._20_4_ * 0.0;
  auVar127._24_4_ = auVar119._24_4_ * 0.0;
  auVar127._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 9 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar113));
  auVar118 = vpbroadcastd_avx512vl();
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar197._0_4_ = auVar105._0_4_ * auVar119._0_4_;
  auVar197._4_4_ = auVar105._4_4_ * auVar119._4_4_;
  auVar197._8_4_ = auVar105._8_4_ * auVar119._8_4_;
  auVar197._12_4_ = auVar105._12_4_ * auVar119._12_4_;
  auVar197._16_4_ = auVar119._16_4_ * 0.0;
  auVar197._20_4_ = auVar119._20_4_ * 0.0;
  auVar197._24_4_ = auVar119._24_4_ * 0.0;
  auVar197._28_4_ = 0;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar8 * 0x10 + uVar102 * -2 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar108));
  auVar126._4_4_ = auVar29._4_4_ * auVar119._4_4_;
  auVar126._0_4_ = auVar29._0_4_ * auVar119._0_4_;
  auVar126._8_4_ = auVar29._8_4_ * auVar119._8_4_;
  auVar126._12_4_ = auVar29._12_4_ * auVar119._12_4_;
  auVar126._16_4_ = auVar119._16_4_ * 0.0;
  auVar126._20_4_ = auVar119._20_4_ * 0.0;
  auVar126._24_4_ = auVar119._24_4_ * 0.0;
  auVar126._28_4_ = auVar119._28_4_;
  auVar119 = vcvtdq2ps_avx(auVar117);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar108));
  auVar188._0_4_ = auVar29._0_4_ * auVar119._0_4_;
  auVar188._4_4_ = auVar29._4_4_ * auVar119._4_4_;
  auVar188._8_4_ = auVar29._8_4_ * auVar119._8_4_;
  auVar188._12_4_ = auVar29._12_4_ * auVar119._12_4_;
  auVar188._16_4_ = auVar119._16_4_ * 0.0;
  auVar188._20_4_ = auVar119._20_4_ * 0.0;
  auVar188._24_4_ = auVar119._24_4_ * 0.0;
  auVar188._28_4_ = 0;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 + uVar102 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar109));
  auVar121._4_4_ = auVar119._4_4_ * auVar6._4_4_;
  auVar121._0_4_ = auVar119._0_4_ * auVar6._0_4_;
  auVar121._8_4_ = auVar119._8_4_ * auVar6._8_4_;
  auVar121._12_4_ = auVar119._12_4_ * auVar6._12_4_;
  auVar121._16_4_ = auVar119._16_4_ * 0.0;
  auVar121._20_4_ = auVar119._20_4_ * 0.0;
  auVar121._24_4_ = auVar119._24_4_ * 0.0;
  auVar121._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x17 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar109));
  auVar130._0_4_ = auVar6._0_4_ * auVar119._0_4_;
  auVar130._4_4_ = auVar6._4_4_ * auVar119._4_4_;
  auVar130._8_4_ = auVar6._8_4_ * auVar119._8_4_;
  auVar130._12_4_ = auVar6._12_4_ * auVar119._12_4_;
  auVar130._16_4_ = auVar119._16_4_ * 0.0;
  auVar130._20_4_ = auVar119._20_4_ * 0.0;
  auVar130._24_4_ = auVar119._24_4_ * 0.0;
  auVar130._28_4_ = 0;
  auVar119 = vpminsd_avx2(auVar127,auVar197);
  auVar117 = vpminsd_avx2(auVar126,auVar188);
  auVar119 = vmaxps_avx(auVar119,auVar117);
  auVar117 = vpminsd_avx2(auVar121,auVar130);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar129._4_4_ = uVar3;
  auVar129._0_4_ = uVar3;
  auVar129._8_4_ = uVar3;
  auVar129._12_4_ = uVar3;
  auVar129._16_4_ = uVar3;
  auVar129._20_4_ = uVar3;
  auVar129._24_4_ = uVar3;
  auVar129._28_4_ = uVar3;
  auVar117 = vmaxps_avx512vl(auVar117,auVar129);
  auVar119 = vmaxps_avx(auVar119,auVar117);
  auVar117._8_4_ = 0x3f7ffffa;
  auVar117._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar117._12_4_ = 0x3f7ffffa;
  auVar117._16_4_ = 0x3f7ffffa;
  auVar117._20_4_ = 0x3f7ffffa;
  auVar117._24_4_ = 0x3f7ffffa;
  auVar117._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar119,auVar117);
  auVar119 = vpmaxsd_avx2(auVar127,auVar197);
  auVar117 = vpmaxsd_avx2(auVar126,auVar188);
  auVar119 = vminps_avx(auVar119,auVar117);
  auVar117 = vpmaxsd_avx2(auVar121,auVar130);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar128._4_4_ = uVar3;
  auVar128._0_4_ = uVar3;
  auVar128._8_4_ = uVar3;
  auVar128._12_4_ = uVar3;
  auVar128._16_4_ = uVar3;
  auVar128._20_4_ = uVar3;
  auVar128._24_4_ = uVar3;
  auVar128._28_4_ = uVar3;
  auVar117 = vminps_avx512vl(auVar117,auVar128);
  auVar119 = vminps_avx(auVar119,auVar117);
  auVar120._8_4_ = 0x3f800003;
  auVar120._0_8_ = 0x3f8000033f800003;
  auVar120._12_4_ = 0x3f800003;
  auVar120._16_4_ = 0x3f800003;
  auVar120._20_4_ = 0x3f800003;
  auVar120._24_4_ = 0x3f800003;
  auVar120._28_4_ = 0x3f800003;
  auVar119 = vmulps_avx512vl(auVar119,auVar120);
  uVar30 = vpcmpgtd_avx512vl(auVar118,_DAT_01fe9900);
  uVar187 = vcmpps_avx512vl(local_320,auVar119,2);
  if ((byte)((byte)uVar187 & (byte)uVar30) != 0) {
    uVar99 = (ulong)(byte)((byte)uVar187 & (byte)uVar30);
    local_7e8 = (undefined1 (*) [32])local_100;
    auVar181 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar181);
    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar181 = ZEXT1664(auVar105);
    auVar242 = ZEXT464(0x35000000);
    sVar100 = k;
    local_7f0 = k;
    do {
      lVar31 = 0;
      for (uVar93 = uVar99; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar99 = uVar99 - 1 & uVar99;
      uVar3 = *(undefined4 *)(prim + lVar31 * 4 + 6);
      uVar93 = (ulong)(uint)((int)lVar31 << 6);
      uVar98 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar98].ptr;
      auVar105 = *(undefined1 (*) [16])(prim + uVar93 + lVar77 + 0x16);
      if (uVar99 != 0) {
        uVar96 = uVar99 - 1 & uVar99;
        for (uVar102 = uVar99; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
        }
        if (uVar96 != 0) {
          for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar29 = *(undefined1 (*) [16])(prim + uVar93 + lVar77 + 0x26);
      auVar6 = *(undefined1 (*) [16])(prim + uVar93 + lVar77 + 0x36);
      auVar113 = *(undefined1 (*) [16])(prim + uVar93 + lVar77 + 0x46);
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar108 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar100 * 4)),
                               ZEXT416(*(uint *)(ray + sVar100 * 4 + 0x40)),0x1c);
      auVar108 = vinsertps_avx(auVar108,ZEXT416(*(uint *)(ray + sVar100 * 4 + 0x80)),0x28);
      auVar107 = vsubps_avx(auVar105,auVar108);
      uVar167 = auVar107._0_4_;
      auVar191._4_4_ = uVar167;
      auVar191._0_4_ = uVar167;
      auVar191._8_4_ = uVar167;
      auVar191._12_4_ = uVar167;
      auVar109 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar201 = pre->ray_space[k].vz.field_0.m128[0];
      fVar166 = pre->ray_space[k].vz.field_0.m128[1];
      fVar182 = pre->ray_space[k].vz.field_0.m128[2];
      fVar183 = pre->ray_space[k].vz.field_0.m128[3];
      auVar110._0_4_ = fVar201 * auVar107._0_4_;
      auVar110._4_4_ = fVar166 * auVar107._4_4_;
      auVar110._8_4_ = fVar182 * auVar107._8_4_;
      auVar110._12_4_ = fVar183 * auVar107._12_4_;
      auVar109 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar5,auVar109);
      auVar7 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar191);
      auVar109 = vshufps_avx(auVar105,auVar105,0xff);
      auVar106 = vsubps_avx(auVar29,auVar108);
      uVar167 = auVar106._0_4_;
      auVar202._4_4_ = uVar167;
      auVar202._0_4_ = uVar167;
      auVar202._8_4_ = uVar167;
      auVar202._12_4_ = uVar167;
      auVar107 = vshufps_avx(auVar106,auVar106,0x55);
      auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
      auVar226._0_4_ = fVar201 * auVar106._0_4_;
      auVar226._4_4_ = fVar166 * auVar106._4_4_;
      auVar226._8_4_ = fVar182 * auVar106._8_4_;
      auVar226._12_4_ = fVar183 * auVar106._12_4_;
      auVar107 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar107);
      auVar191 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar4,auVar202);
      auVar106 = vsubps_avx512vl(auVar6,auVar108);
      uVar167 = auVar106._0_4_;
      auVar203._4_4_ = uVar167;
      auVar203._0_4_ = uVar167;
      auVar203._8_4_ = uVar167;
      auVar203._12_4_ = uVar167;
      auVar107 = vshufps_avx(auVar106,auVar106,0x55);
      auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
      auVar111._0_4_ = fVar201 * auVar106._0_4_;
      auVar111._4_4_ = fVar166 * auVar106._4_4_;
      auVar111._8_4_ = fVar182 * auVar106._8_4_;
      auVar111._12_4_ = fVar183 * auVar106._12_4_;
      auVar107 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar5,auVar107);
      auVar106 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar4,auVar203);
      auVar107 = vsubps_avx512vl(auVar113,auVar108);
      uVar167 = auVar107._0_4_;
      auVar192._4_4_ = uVar167;
      auVar192._0_4_ = uVar167;
      auVar192._8_4_ = uVar167;
      auVar192._12_4_ = uVar167;
      auVar108 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      auVar112._0_4_ = fVar201 * auVar107._0_4_;
      auVar112._4_4_ = fVar166 * auVar107._4_4_;
      auVar112._8_4_ = fVar182 * auVar107._8_4_;
      auVar112._12_4_ = fVar183 * auVar107._12_4_;
      auVar108 = vfmadd231ps_fma(auVar112,(undefined1  [16])aVar5,auVar108);
      auVar107 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar4,auVar192);
      lVar31 = (long)iVar9 * 0x44;
      auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar31);
      uVar167 = auVar7._0_4_;
      local_620._4_4_ = uVar167;
      local_620._0_4_ = uVar167;
      local_620._8_4_ = uVar167;
      local_620._12_4_ = uVar167;
      local_620._16_4_ = uVar167;
      local_620._20_4_ = uVar167;
      local_620._24_4_ = uVar167;
      local_620._28_4_ = uVar167;
      auVar172._8_4_ = 1;
      auVar172._0_8_ = 0x100000001;
      auVar172._12_4_ = 1;
      auVar172._16_4_ = 1;
      auVar172._20_4_ = 1;
      auVar172._24_4_ = 1;
      auVar172._28_4_ = 1;
      local_640 = vpermps_avx2(auVar172,ZEXT1632(auVar7));
      auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar31 + 0x484);
      local_660 = vbroadcastss_avx512vl(auVar191);
      local_680 = vpermps_avx512vl(auVar172,ZEXT1632(auVar191));
      auVar129 = *(undefined1 (*) [32])(bspline_basis0 + lVar31 + 0x908);
      local_6a0 = vbroadcastss_avx512vl(auVar106);
      local_6c0 = vpermps_avx512vl(auVar172,ZEXT1632(auVar106));
      auVar128 = *(undefined1 (*) [32])(bspline_basis0 + lVar31 + 0xd8c);
      fVar190 = auVar107._0_4_;
      local_6e0._4_4_ = fVar190;
      local_6e0._0_4_ = fVar190;
      fStack_6d8 = fVar190;
      fStack_6d4 = fVar190;
      fStack_6d0 = fVar190;
      fStack_6cc = fVar190;
      fStack_6c8 = fVar190;
      register0x0000139c = fVar190;
      _local_700 = vpermps_avx512vl(auVar172,ZEXT1632(auVar107));
      auVar120 = vmulps_avx512vl(_local_6e0,auVar128);
      auVar118 = vmulps_avx512vl(_local_700,auVar128);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar129,local_6a0);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar129,local_6c0);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,local_660);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar117,local_680);
      auVar121 = vfmadd231ps_avx512vl(auVar120,auVar119,local_620);
      auVar221 = ZEXT3264(auVar121);
      auVar122 = vfmadd231ps_avx512vl(auVar118,auVar119,local_640);
      auVar218 = ZEXT3264(auVar122);
      auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar31);
      auVar118 = *(undefined1 (*) [32])(bspline_basis1 + lVar31 + 0x484);
      auVar127 = *(undefined1 (*) [32])(bspline_basis1 + lVar31 + 0x908);
      auVar126 = *(undefined1 (*) [32])(bspline_basis1 + lVar31 + 0xd8c);
      auVar116 = vmulps_avx512vl(_local_6e0,auVar126);
      auVar123 = vmulps_avx512vl(_local_700,auVar126);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar127,local_6a0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar127,local_6c0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar118,local_660);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar118,local_680);
      auVar192 = vfmadd231ps_fma(auVar116,auVar120,local_620);
      auVar225 = ZEXT1664(auVar192);
      auVar202 = vfmadd231ps_fma(auVar123,auVar120,local_640);
      auVar116 = vsubps_avx512vl(ZEXT1632(auVar192),auVar121);
      auVar123 = vsubps_avx512vl(ZEXT1632(auVar202),auVar122);
      auVar124 = vmulps_avx512vl(auVar122,auVar116);
      auVar114 = vmulps_avx512vl(auVar121,auVar123);
      auVar124 = vsubps_avx512vl(auVar124,auVar114);
      auVar108 = vshufps_avx(auVar29,auVar29,0xff);
      uVar187 = auVar109._0_8_;
      local_340._8_8_ = uVar187;
      local_340._0_8_ = uVar187;
      local_340._16_8_ = uVar187;
      local_340._24_8_ = uVar187;
      local_360 = vbroadcastsd_avx512vl(auVar108);
      auVar108 = vshufps_avx512vl(auVar6,auVar6,0xff);
      local_380 = vbroadcastsd_avx512vl(auVar108);
      auVar108 = vshufps_avx512vl(auVar113,auVar113,0xff);
      uVar187 = auVar108._0_8_;
      local_3a0._8_8_ = uVar187;
      local_3a0._0_8_ = uVar187;
      local_3a0._16_8_ = uVar187;
      local_3a0._24_8_ = uVar187;
      auVar114 = vmulps_avx512vl(local_3a0,auVar128);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar129,local_380);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,local_360);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar119,local_340);
      auVar115 = vmulps_avx512vl(local_3a0,auVar126);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar127,local_380);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar118,local_360);
      auVar203 = vfmadd231ps_fma(auVar115,auVar120,local_340);
      auVar115 = vmulps_avx512vl(auVar123,auVar123);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar116,auVar116);
      auVar125 = vmaxps_avx512vl(auVar114,ZEXT1632(auVar203));
      auVar125 = vmulps_avx512vl(auVar125,auVar125);
      auVar115 = vmulps_avx512vl(auVar125,auVar115);
      auVar124 = vmulps_avx512vl(auVar124,auVar124);
      uVar187 = vcmpps_avx512vl(auVar124,auVar115,2);
      auVar108 = vblendps_avx(auVar7,auVar105,8);
      auVar226 = auVar181._0_16_;
      auVar109 = vandps_avx512vl(auVar108,auVar226);
      auVar108 = vblendps_avx(auVar191,auVar29,8);
      auVar108 = vandps_avx512vl(auVar108,auVar226);
      auVar109 = vmaxps_avx(auVar109,auVar108);
      auVar108 = vblendps_avx(auVar106,auVar6,8);
      auVar110 = vandps_avx512vl(auVar108,auVar226);
      auVar108 = vblendps_avx(auVar107,auVar113,8);
      auVar108 = vandps_avx512vl(auVar108,auVar226);
      auVar108 = vmaxps_avx(auVar110,auVar108);
      auVar108 = vmaxps_avx(auVar109,auVar108);
      auVar109 = vmovshdup_avx(auVar108);
      auVar109 = vmaxss_avx(auVar109,auVar108);
      auVar108 = vshufpd_avx(auVar108,auVar108,1);
      auVar108 = vmaxss_avx(auVar108,auVar109);
      local_800 = vcvtsi2ss_avx512f(auVar113,iVar9);
      auVar231._0_4_ = local_800._0_4_;
      auVar231._4_4_ = auVar231._0_4_;
      auVar231._8_4_ = auVar231._0_4_;
      auVar231._12_4_ = auVar231._0_4_;
      auVar231._16_4_ = auVar231._0_4_;
      auVar231._20_4_ = auVar231._0_4_;
      auVar231._24_4_ = auVar231._0_4_;
      auVar231._28_4_ = auVar231._0_4_;
      uVar30 = vcmpps_avx512vl(auVar231,_DAT_01faff40,0xe);
      bVar101 = (byte)uVar187 & (byte)uVar30;
      auVar108 = vmulss_avx512f(auVar108,auVar242._0_16_);
      auVar115 = auVar241._0_32_;
      auVar124 = vpermps_avx512vl(auVar115,ZEXT1632(auVar7));
      local_4a0 = vpermps_avx512vl(auVar115,ZEXT1632(auVar191));
      local_4c0 = vpermps_avx512vl(auVar115,ZEXT1632(auVar106));
      local_4e0 = vpermps_avx512vl(auVar115,ZEXT1632(auVar107));
      uVar94 = *(uint *)(ray + sVar100 * 4 + 0xc0);
      local_780._0_16_ = ZEXT416(uVar94);
      local_880 = auVar108._0_4_;
      local_840 = auVar29._0_8_;
      uStack_838 = auVar29._8_8_;
      local_850 = auVar6._0_8_;
      uStack_848 = auVar6._8_8_;
      local_860._0_4_ = auVar113._0_4_;
      fVar201 = (float)local_860;
      local_860._4_4_ = auVar113._4_4_;
      fVar166 = local_860._4_4_;
      uStack_858._0_4_ = auVar113._8_4_;
      fVar182 = (float)uStack_858;
      uStack_858._4_4_ = auVar113._12_4_;
      fVar183 = uStack_858._4_4_;
      local_860 = auVar113._0_8_;
      uStack_858 = auVar113._8_8_;
      if (bVar101 != 0) {
        auVar126 = vmulps_avx512vl(local_4e0,auVar126);
        auVar127 = vfmadd213ps_avx512vl(auVar127,local_4c0,auVar126);
        auVar118 = vfmadd213ps_avx512vl(auVar118,local_4a0,auVar127);
        auVar118 = vfmadd213ps_avx512vl(auVar120,auVar124,auVar118);
        auVar128 = vmulps_avx512vl(local_4e0,auVar128);
        auVar129 = vfmadd213ps_avx512vl(auVar129,local_4c0,auVar128);
        auVar127 = vfmadd213ps_avx512vl(auVar117,local_4a0,auVar129);
        auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar31 + 0x1210);
        auVar129 = *(undefined1 (*) [32])(bspline_basis0 + lVar31 + 0x1694);
        auVar128 = *(undefined1 (*) [32])(bspline_basis0 + lVar31 + 0x1b18);
        auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar31 + 0x1f9c);
        auVar127 = vfmadd213ps_avx512vl(auVar119,auVar124,auVar127);
        auVar227._0_4_ = fVar190 * auVar120._0_4_;
        auVar227._4_4_ = fVar190 * auVar120._4_4_;
        auVar227._8_4_ = fVar190 * auVar120._8_4_;
        auVar227._12_4_ = fVar190 * auVar120._12_4_;
        auVar227._16_4_ = fVar190 * auVar120._16_4_;
        auVar227._20_4_ = fVar190 * auVar120._20_4_;
        auVar227._24_4_ = fVar190 * auVar120._24_4_;
        auVar227._28_4_ = 0;
        auVar119 = vmulps_avx512vl(_local_700,auVar120);
        auVar120 = vmulps_avx512vl(local_4e0,auVar120);
        auVar126 = vfmadd231ps_avx512vl(auVar227,auVar128,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar128,local_6c0);
        auVar128 = vfmadd231ps_avx512vl(auVar120,local_4c0,auVar128);
        auVar120 = vfmadd231ps_avx512vl(auVar126,auVar129,local_660);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar129,local_680);
        auVar126 = vfmadd231ps_avx512vl(auVar128,local_4a0,auVar129);
        auVar113 = vfmadd231ps_fma(auVar120,auVar117,local_620);
        auVar120 = vfmadd231ps_avx512vl(auVar119,auVar117,local_640);
        auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar31 + 0x1210);
        auVar129 = *(undefined1 (*) [32])(bspline_basis1 + lVar31 + 0x1b18);
        auVar128 = *(undefined1 (*) [32])(bspline_basis1 + lVar31 + 0x1f9c);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar124,auVar117);
        auVar43._4_4_ = fVar190 * auVar128._4_4_;
        auVar43._0_4_ = fVar190 * auVar128._0_4_;
        auVar43._8_4_ = fVar190 * auVar128._8_4_;
        auVar43._12_4_ = fVar190 * auVar128._12_4_;
        auVar43._16_4_ = fVar190 * auVar128._16_4_;
        auVar43._20_4_ = fVar190 * auVar128._20_4_;
        auVar43._24_4_ = fVar190 * auVar128._24_4_;
        auVar43._28_4_ = auVar117._28_4_;
        auVar117 = vmulps_avx512vl(_local_700,auVar128);
        auVar128 = vmulps_avx512vl(local_4e0,auVar128);
        auVar125 = vfmadd231ps_avx512vl(auVar43,auVar129,local_6a0);
        auVar130 = vfmadd231ps_avx512vl(auVar117,auVar129,local_6c0);
        auVar240 = ZEXT3264(auVar124);
        auVar129 = vfmadd231ps_avx512vl(auVar128,local_4c0,auVar129);
        auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar31 + 0x1694);
        auVar128 = vfmadd231ps_avx512vl(auVar125,auVar117,local_660);
        auVar125 = vfmadd231ps_avx512vl(auVar130,auVar117,local_680);
        auVar117 = vfmadd231ps_avx512vl(auVar129,local_4a0,auVar117);
        auVar242 = ZEXT1664(auVar242._0_16_);
        auVar241 = ZEXT3264(auVar115);
        auVar181 = ZEXT1664(auVar226);
        auVar108 = vfmadd231ps_fma(auVar128,auVar119,local_620);
        auVar129 = vfmadd231ps_avx512vl(auVar125,auVar119,local_640);
        auVar128 = vfmadd231ps_avx512vl(auVar117,auVar124,auVar119);
        auVar235._8_4_ = 0x7fffffff;
        auVar235._0_8_ = 0x7fffffff7fffffff;
        auVar235._12_4_ = 0x7fffffff;
        auVar235._16_4_ = 0x7fffffff;
        auVar235._20_4_ = 0x7fffffff;
        auVar235._24_4_ = 0x7fffffff;
        auVar235._28_4_ = 0x7fffffff;
        auVar119 = vandps_avx(ZEXT1632(auVar113),auVar235);
        auVar117 = vandps_avx(auVar120,auVar235);
        auVar117 = vmaxps_avx(auVar119,auVar117);
        auVar119 = vandps_avx(auVar126,auVar235);
        auVar119 = vmaxps_avx(auVar117,auVar119);
        auVar230._4_4_ = local_880;
        auVar230._0_4_ = local_880;
        auVar230._8_4_ = local_880;
        auVar230._12_4_ = local_880;
        auVar230._16_4_ = local_880;
        auVar230._20_4_ = local_880;
        auVar230._24_4_ = local_880;
        auVar230._28_4_ = local_880;
        uVar93 = vcmpps_avx512vl(auVar119,auVar230,1);
        bVar14 = (bool)((byte)uVar93 & 1);
        auVar131._0_4_ = (float)((uint)bVar14 * auVar116._0_4_ | (uint)!bVar14 * auVar113._0_4_);
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar113._4_4_);
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar113._8_4_);
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar113._12_4_);
        fVar190 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar116._16_4_);
        auVar131._16_4_ = fVar190;
        fVar185 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar116._20_4_);
        auVar131._20_4_ = fVar185;
        fVar184 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar116._24_4_);
        auVar131._24_4_ = fVar184;
        uVar95 = (uint)(byte)(uVar93 >> 7) * auVar116._28_4_;
        auVar131._28_4_ = uVar95;
        bVar14 = (bool)((byte)uVar93 & 1);
        auVar132._0_4_ = (float)((uint)bVar14 * auVar123._0_4_ | (uint)!bVar14 * auVar120._0_4_);
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar14 * auVar123._4_4_ | (uint)!bVar14 * auVar120._4_4_);
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar14 * auVar123._8_4_ | (uint)!bVar14 * auVar120._8_4_);
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar14 * auVar123._12_4_ | (uint)!bVar14 * auVar120._12_4_);
        bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar132._16_4_ = (float)((uint)bVar14 * auVar123._16_4_ | (uint)!bVar14 * auVar120._16_4_);
        bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar132._20_4_ = (float)((uint)bVar14 * auVar123._20_4_ | (uint)!bVar14 * auVar120._20_4_);
        bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar132._24_4_ = (float)((uint)bVar14 * auVar123._24_4_ | (uint)!bVar14 * auVar120._24_4_);
        bVar14 = SUB81(uVar93 >> 7,0);
        auVar132._28_4_ = (uint)bVar14 * auVar123._28_4_ | (uint)!bVar14 * auVar120._28_4_;
        auVar119 = vandps_avx(auVar235,ZEXT1632(auVar108));
        auVar117 = vandps_avx(auVar129,auVar235);
        auVar117 = vmaxps_avx(auVar119,auVar117);
        auVar119 = vandps_avx(auVar128,auVar235);
        auVar119 = vmaxps_avx(auVar117,auVar119);
        uVar93 = vcmpps_avx512vl(auVar119,auVar230,1);
        bVar14 = (bool)((byte)uVar93 & 1);
        auVar133._0_4_ = (float)((uint)bVar14 * auVar116._0_4_ | (uint)!bVar14 * auVar108._0_4_);
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar108._4_4_);
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar108._8_4_);
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar108._12_4_);
        fVar207 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar116._16_4_);
        auVar133._16_4_ = fVar207;
        fVar200 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar116._20_4_);
        auVar133._20_4_ = fVar200;
        fVar186 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar116._24_4_);
        auVar133._24_4_ = fVar186;
        auVar133._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar116._28_4_;
        bVar14 = (bool)((byte)uVar93 & 1);
        auVar134._0_4_ = (float)((uint)bVar14 * auVar123._0_4_ | (uint)!bVar14 * auVar129._0_4_);
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar14 * auVar123._4_4_ | (uint)!bVar14 * auVar129._4_4_);
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar14 * auVar123._8_4_ | (uint)!bVar14 * auVar129._8_4_);
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar14 * auVar123._12_4_ | (uint)!bVar14 * auVar129._12_4_);
        bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar134._16_4_ = (float)((uint)bVar14 * auVar123._16_4_ | (uint)!bVar14 * auVar129._16_4_);
        bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar134._20_4_ = (float)((uint)bVar14 * auVar123._20_4_ | (uint)!bVar14 * auVar129._20_4_);
        bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar134._24_4_ = (float)((uint)bVar14 * auVar123._24_4_ | (uint)!bVar14 * auVar129._24_4_);
        bVar14 = SUB81(uVar93 >> 7,0);
        auVar134._28_4_ = (uint)bVar14 * auVar123._28_4_ | (uint)!bVar14 * auVar129._28_4_;
        auVar111 = vxorps_avx512vl(local_660._0_16_,local_660._0_16_);
        auVar119 = vfmadd213ps_avx512vl(auVar131,auVar131,ZEXT1632(auVar111));
        auVar113 = vfmadd231ps_fma(auVar119,auVar132,auVar132);
        auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar113));
        fVar103 = auVar119._0_4_;
        fVar104 = auVar119._4_4_;
        fVar157 = auVar119._8_4_;
        fVar158 = auVar119._12_4_;
        fVar159 = auVar119._16_4_;
        fVar160 = auVar119._20_4_;
        fVar162 = auVar119._24_4_;
        auVar44._4_4_ = fVar104 * fVar104 * fVar104 * auVar113._4_4_ * -0.5;
        auVar44._0_4_ = fVar103 * fVar103 * fVar103 * auVar113._0_4_ * -0.5;
        auVar44._8_4_ = fVar157 * fVar157 * fVar157 * auVar113._8_4_ * -0.5;
        auVar44._12_4_ = fVar158 * fVar158 * fVar158 * auVar113._12_4_ * -0.5;
        auVar44._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
        auVar44._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar44._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar44._28_4_ = 0;
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar129 = vfmadd231ps_avx512vl(auVar44,auVar117,auVar119);
        auVar45._4_4_ = auVar132._4_4_ * auVar129._4_4_;
        auVar45._0_4_ = auVar132._0_4_ * auVar129._0_4_;
        auVar45._8_4_ = auVar132._8_4_ * auVar129._8_4_;
        auVar45._12_4_ = auVar132._12_4_ * auVar129._12_4_;
        auVar45._16_4_ = auVar132._16_4_ * auVar129._16_4_;
        auVar45._20_4_ = auVar132._20_4_ * auVar129._20_4_;
        auVar45._24_4_ = auVar132._24_4_ * auVar129._24_4_;
        auVar45._28_4_ = auVar119._28_4_;
        auVar46._4_4_ = auVar129._4_4_ * -auVar131._4_4_;
        auVar46._0_4_ = auVar129._0_4_ * -auVar131._0_4_;
        auVar46._8_4_ = auVar129._8_4_ * -auVar131._8_4_;
        auVar46._12_4_ = auVar129._12_4_ * -auVar131._12_4_;
        auVar46._16_4_ = auVar129._16_4_ * -fVar190;
        auVar46._20_4_ = auVar129._20_4_ * -fVar185;
        auVar46._24_4_ = auVar129._24_4_ * -fVar184;
        auVar46._28_4_ = uVar95 ^ 0x80000000;
        auVar119 = vmulps_avx512vl(auVar129,ZEXT1632(auVar111));
        auVar116 = ZEXT1632(auVar111);
        auVar128 = vfmadd213ps_avx512vl(auVar133,auVar133,auVar116);
        auVar113 = vfmadd231ps_fma(auVar128,auVar134,auVar134);
        auVar128 = vrsqrt14ps_avx512vl(ZEXT1632(auVar113));
        fVar190 = auVar128._0_4_;
        fVar184 = auVar128._4_4_;
        fVar185 = auVar128._8_4_;
        fVar103 = auVar128._12_4_;
        fVar104 = auVar128._16_4_;
        fVar157 = auVar128._20_4_;
        fVar158 = auVar128._24_4_;
        auVar47._4_4_ = fVar184 * fVar184 * fVar184 * auVar113._4_4_ * -0.5;
        auVar47._0_4_ = fVar190 * fVar190 * fVar190 * auVar113._0_4_ * -0.5;
        auVar47._8_4_ = fVar185 * fVar185 * fVar185 * auVar113._8_4_ * -0.5;
        auVar47._12_4_ = fVar103 * fVar103 * fVar103 * auVar113._12_4_ * -0.5;
        auVar47._16_4_ = fVar104 * fVar104 * fVar104 * -0.0;
        auVar47._20_4_ = fVar157 * fVar157 * fVar157 * -0.0;
        auVar47._24_4_ = fVar158 * fVar158 * fVar158 * -0.0;
        auVar47._28_4_ = 0;
        auVar117 = vfmadd231ps_avx512vl(auVar47,auVar117,auVar128);
        auVar48._4_4_ = auVar134._4_4_ * auVar117._4_4_;
        auVar48._0_4_ = auVar134._0_4_ * auVar117._0_4_;
        auVar48._8_4_ = auVar134._8_4_ * auVar117._8_4_;
        auVar48._12_4_ = auVar134._12_4_ * auVar117._12_4_;
        auVar48._16_4_ = auVar134._16_4_ * auVar117._16_4_;
        auVar48._20_4_ = auVar134._20_4_ * auVar117._20_4_;
        auVar48._24_4_ = auVar134._24_4_ * auVar117._24_4_;
        auVar48._28_4_ = auVar128._28_4_;
        auVar49._4_4_ = -auVar133._4_4_ * auVar117._4_4_;
        auVar49._0_4_ = -auVar133._0_4_ * auVar117._0_4_;
        auVar49._8_4_ = -auVar133._8_4_ * auVar117._8_4_;
        auVar49._12_4_ = -auVar133._12_4_ * auVar117._12_4_;
        auVar49._16_4_ = -fVar207 * auVar117._16_4_;
        auVar49._20_4_ = -fVar200 * auVar117._20_4_;
        auVar49._24_4_ = -fVar186 * auVar117._24_4_;
        auVar49._28_4_ = auVar129._28_4_;
        auVar117 = vmulps_avx512vl(auVar117,auVar116);
        auVar113 = vfmadd213ps_fma(auVar45,auVar114,auVar121);
        auVar108 = vfmadd213ps_fma(auVar46,auVar114,auVar122);
        auVar129 = vfmadd213ps_avx512vl(auVar119,auVar114,auVar127);
        auVar128 = vfmadd213ps_avx512vl(auVar48,ZEXT1632(auVar203),ZEXT1632(auVar192));
        auVar191 = vfnmadd213ps_fma(auVar45,auVar114,auVar121);
        auVar126 = ZEXT1632(auVar203);
        auVar109 = vfmadd213ps_fma(auVar49,auVar126,ZEXT1632(auVar202));
        auVar110 = vfnmadd213ps_fma(auVar46,auVar114,auVar122);
        auVar107 = vfmadd213ps_fma(auVar117,auVar126,auVar118);
        auVar120 = vfnmadd231ps_avx512vl(auVar127,auVar114,auVar119);
        auVar192 = vfnmadd213ps_fma(auVar48,auVar126,ZEXT1632(auVar192));
        auVar202 = vfnmadd213ps_fma(auVar49,auVar126,ZEXT1632(auVar202));
        auVar226 = vfnmadd231ps_fma(auVar118,ZEXT1632(auVar203),auVar117);
        auVar117 = vsubps_avx512vl(auVar128,ZEXT1632(auVar191));
        auVar119 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar110));
        auVar118 = vsubps_avx512vl(ZEXT1632(auVar107),auVar120);
        auVar127 = vmulps_avx512vl(auVar119,auVar120);
        auVar106 = vfmsub231ps_fma(auVar127,ZEXT1632(auVar110),auVar118);
        auVar50._4_4_ = auVar191._4_4_ * auVar118._4_4_;
        auVar50._0_4_ = auVar191._0_4_ * auVar118._0_4_;
        auVar50._8_4_ = auVar191._8_4_ * auVar118._8_4_;
        auVar50._12_4_ = auVar191._12_4_ * auVar118._12_4_;
        auVar50._16_4_ = auVar118._16_4_ * 0.0;
        auVar50._20_4_ = auVar118._20_4_ * 0.0;
        auVar50._24_4_ = auVar118._24_4_ * 0.0;
        auVar50._28_4_ = auVar118._28_4_;
        auVar118 = vfmsub231ps_avx512vl(auVar50,auVar120,auVar117);
        auVar51._4_4_ = auVar110._4_4_ * auVar117._4_4_;
        auVar51._0_4_ = auVar110._0_4_ * auVar117._0_4_;
        auVar51._8_4_ = auVar110._8_4_ * auVar117._8_4_;
        auVar51._12_4_ = auVar110._12_4_ * auVar117._12_4_;
        auVar51._16_4_ = auVar117._16_4_ * 0.0;
        auVar51._20_4_ = auVar117._20_4_ * 0.0;
        auVar51._24_4_ = auVar117._24_4_ * 0.0;
        auVar51._28_4_ = auVar117._28_4_;
        auVar7 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar191),auVar119);
        auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar116,auVar118);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,ZEXT1632(auVar106));
        auVar123 = ZEXT1632(auVar111);
        uVar93 = vcmpps_avx512vl(auVar119,auVar123,2);
        bVar92 = (byte)uVar93;
        fVar103 = (float)((uint)(bVar92 & 1) * auVar113._0_4_ |
                         (uint)!(bool)(bVar92 & 1) * auVar192._0_4_);
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        fVar157 = (float)((uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar192._4_4_);
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        fVar159 = (float)((uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar192._8_4_);
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        fVar162 = (float)((uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar192._12_4_);
        auVar127 = ZEXT1632(CONCAT412(fVar162,CONCAT48(fVar159,CONCAT44(fVar157,fVar103))));
        fVar104 = (float)((uint)(bVar92 & 1) * auVar108._0_4_ |
                         (uint)!(bool)(bVar92 & 1) * auVar202._0_4_);
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        fVar158 = (float)((uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar202._4_4_);
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        fVar160 = (float)((uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar202._8_4_);
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        fVar163 = (float)((uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar202._12_4_);
        auVar126 = ZEXT1632(CONCAT412(fVar163,CONCAT48(fVar160,CONCAT44(fVar158,fVar104))));
        auVar135._0_4_ =
             (float)((uint)(bVar92 & 1) * auVar129._0_4_ |
                    (uint)!(bool)(bVar92 & 1) * auVar226._0_4_);
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar14 * auVar129._4_4_ | (uint)!bVar14 * auVar226._4_4_);
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar14 * auVar129._8_4_ | (uint)!bVar14 * auVar226._8_4_);
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar14 * auVar129._12_4_ | (uint)!bVar14 * auVar226._12_4_);
        fVar184 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar129._16_4_);
        auVar135._16_4_ = fVar184;
        fVar190 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar129._20_4_);
        auVar135._20_4_ = fVar190;
        fVar185 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar129._24_4_);
        auVar135._24_4_ = fVar185;
        iVar1 = (uint)(byte)(uVar93 >> 7) * auVar129._28_4_;
        auVar135._28_4_ = iVar1;
        auVar117 = vblendmps_avx512vl(ZEXT1632(auVar191),auVar128);
        auVar136._0_4_ =
             (uint)(bVar92 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar106._0_4_;
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar106._4_4_;
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar106._8_4_;
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar106._12_4_;
        auVar136._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * auVar117._16_4_;
        auVar136._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * auVar117._20_4_;
        auVar136._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * auVar117._24_4_;
        auVar136._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar117._28_4_;
        auVar117 = vblendmps_avx512vl(ZEXT1632(auVar110),ZEXT1632(auVar109));
        auVar137._0_4_ =
             (float)((uint)(bVar92 & 1) * auVar117._0_4_ |
                    (uint)!(bool)(bVar92 & 1) * auVar108._0_4_);
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar137._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar108._4_4_);
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar137._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar108._8_4_);
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar137._12_4_ = (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar108._12_4_);
        fVar207 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar117._16_4_);
        auVar137._16_4_ = fVar207;
        fVar200 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar117._20_4_);
        auVar137._20_4_ = fVar200;
        fVar186 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar117._24_4_);
        auVar137._24_4_ = fVar186;
        auVar137._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar117._28_4_;
        auVar117 = vblendmps_avx512vl(auVar120,ZEXT1632(auVar107));
        auVar138._0_4_ =
             (float)((uint)(bVar92 & 1) * auVar117._0_4_ |
                    (uint)!(bool)(bVar92 & 1) * auVar129._0_4_);
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar129._4_4_);
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar129._8_4_);
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar129._12_4_);
        bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar138._16_4_ = (float)((uint)bVar14 * auVar117._16_4_ | (uint)!bVar14 * auVar129._16_4_);
        bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar138._20_4_ = (float)((uint)bVar14 * auVar117._20_4_ | (uint)!bVar14 * auVar129._20_4_);
        bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar138._24_4_ = (float)((uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * auVar129._24_4_);
        bVar14 = SUB81(uVar93 >> 7,0);
        auVar138._28_4_ = (uint)bVar14 * auVar117._28_4_ | (uint)!bVar14 * auVar129._28_4_;
        auVar139._0_4_ =
             (uint)(bVar92 & 1) * (int)auVar191._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar128._0_4_;
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar139._4_4_ = (uint)bVar14 * (int)auVar191._4_4_ | (uint)!bVar14 * auVar128._4_4_;
        bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar139._8_4_ = (uint)bVar14 * (int)auVar191._8_4_ | (uint)!bVar14 * auVar128._8_4_;
        bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar139._12_4_ = (uint)bVar14 * (int)auVar191._12_4_ | (uint)!bVar14 * auVar128._12_4_;
        auVar139._16_4_ = (uint)!(bool)((byte)(uVar93 >> 4) & 1) * auVar128._16_4_;
        auVar139._20_4_ = (uint)!(bool)((byte)(uVar93 >> 5) & 1) * auVar128._20_4_;
        auVar139._24_4_ = (uint)!(bool)((byte)(uVar93 >> 6) & 1) * auVar128._24_4_;
        auVar139._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar128._28_4_;
        bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar140._0_4_ =
             (uint)(bVar92 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar107._0_4_;
        bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar15 * auVar120._4_4_ | (uint)!bVar15 * auVar107._4_4_;
        bVar15 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar15 * auVar120._8_4_ | (uint)!bVar15 * auVar107._8_4_;
        bVar15 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar15 * auVar120._12_4_ | (uint)!bVar15 * auVar107._12_4_;
        auVar140._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * auVar120._16_4_;
        auVar140._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * auVar120._20_4_;
        auVar140._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * auVar120._24_4_;
        iVar2 = (uint)(byte)(uVar93 >> 7) * auVar120._28_4_;
        auVar140._28_4_ = iVar2;
        auVar121 = vsubps_avx512vl(auVar139,auVar127);
        auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar110._12_4_ |
                                                 (uint)!bVar17 * auVar109._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar110._8_4_ |
                                                          (uint)!bVar16 * auVar109._8_4_,
                                                          CONCAT44((uint)bVar14 *
                                                                   (int)auVar110._4_4_ |
                                                                   (uint)!bVar14 * auVar109._4_4_,
                                                                   (uint)(bVar92 & 1) *
                                                                   (int)auVar110._0_4_ |
                                                                   (uint)!(bool)(bVar92 & 1) *
                                                                   auVar109._0_4_)))),auVar126);
        auVar221 = ZEXT3264(auVar117);
        auVar129 = vsubps_avx(auVar140,auVar135);
        auVar128 = vsubps_avx(auVar127,auVar136);
        auVar225 = ZEXT3264(auVar128);
        auVar120 = vsubps_avx(auVar126,auVar137);
        auVar118 = vsubps_avx(auVar135,auVar138);
        auVar52._4_4_ = auVar129._4_4_ * fVar157;
        auVar52._0_4_ = auVar129._0_4_ * fVar103;
        auVar52._8_4_ = auVar129._8_4_ * fVar159;
        auVar52._12_4_ = auVar129._12_4_ * fVar162;
        auVar52._16_4_ = auVar129._16_4_ * 0.0;
        auVar52._20_4_ = auVar129._20_4_ * 0.0;
        auVar52._24_4_ = auVar129._24_4_ * 0.0;
        auVar52._28_4_ = iVar2;
        auVar113 = vfmsub231ps_fma(auVar52,auVar135,auVar121);
        auVar53._4_4_ = fVar158 * auVar121._4_4_;
        auVar53._0_4_ = fVar104 * auVar121._0_4_;
        auVar53._8_4_ = fVar160 * auVar121._8_4_;
        auVar53._12_4_ = fVar163 * auVar121._12_4_;
        auVar53._16_4_ = auVar121._16_4_ * 0.0;
        auVar53._20_4_ = auVar121._20_4_ * 0.0;
        auVar53._24_4_ = auVar121._24_4_ * 0.0;
        auVar53._28_4_ = auVar119._28_4_;
        auVar108 = vfmsub231ps_fma(auVar53,auVar127,auVar117);
        auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),auVar123,ZEXT1632(auVar113));
        auVar214._0_4_ = auVar117._0_4_ * auVar135._0_4_;
        auVar214._4_4_ = auVar117._4_4_ * auVar135._4_4_;
        auVar214._8_4_ = auVar117._8_4_ * auVar135._8_4_;
        auVar214._12_4_ = auVar117._12_4_ * auVar135._12_4_;
        auVar214._16_4_ = auVar117._16_4_ * fVar184;
        auVar214._20_4_ = auVar117._20_4_ * fVar190;
        auVar214._24_4_ = auVar117._24_4_ * fVar185;
        auVar214._28_4_ = 0;
        auVar113 = vfmsub231ps_fma(auVar214,auVar126,auVar129);
        auVar122 = vfmadd231ps_avx512vl(auVar119,auVar123,ZEXT1632(auVar113));
        auVar119 = vmulps_avx512vl(auVar118,auVar136);
        auVar119 = vfmsub231ps_avx512vl(auVar119,auVar128,auVar138);
        auVar54._4_4_ = auVar120._4_4_ * auVar138._4_4_;
        auVar54._0_4_ = auVar120._0_4_ * auVar138._0_4_;
        auVar54._8_4_ = auVar120._8_4_ * auVar138._8_4_;
        auVar54._12_4_ = auVar120._12_4_ * auVar138._12_4_;
        auVar54._16_4_ = auVar120._16_4_ * auVar138._16_4_;
        auVar54._20_4_ = auVar120._20_4_ * auVar138._20_4_;
        auVar54._24_4_ = auVar120._24_4_ * auVar138._24_4_;
        auVar54._28_4_ = auVar138._28_4_;
        auVar113 = vfmsub231ps_fma(auVar54,auVar137,auVar118);
        auVar215._0_4_ = auVar137._0_4_ * auVar128._0_4_;
        auVar215._4_4_ = auVar137._4_4_ * auVar128._4_4_;
        auVar215._8_4_ = auVar137._8_4_ * auVar128._8_4_;
        auVar215._12_4_ = auVar137._12_4_ * auVar128._12_4_;
        auVar215._16_4_ = fVar207 * auVar128._16_4_;
        auVar215._20_4_ = fVar200 * auVar128._20_4_;
        auVar215._24_4_ = fVar186 * auVar128._24_4_;
        auVar215._28_4_ = 0;
        auVar108 = vfmsub231ps_fma(auVar215,auVar120,auVar136);
        auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),auVar123,auVar119);
        auVar116 = vfmadd231ps_avx512vl(auVar119,auVar123,ZEXT1632(auVar113));
        auVar218 = ZEXT3264(auVar116);
        auVar119 = vmaxps_avx(auVar122,auVar116);
        uVar187 = vcmpps_avx512vl(auVar119,auVar123,2);
        bVar101 = bVar101 & (byte)uVar187;
        if (bVar101 != 0) {
          uVar167 = *(undefined4 *)(ray + sVar100 * 4 + 0x200);
          auVar236._4_4_ = uVar167;
          auVar236._0_4_ = uVar167;
          auVar236._8_4_ = uVar167;
          auVar236._12_4_ = uVar167;
          auVar236._16_4_ = uVar167;
          auVar236._20_4_ = uVar167;
          auVar236._24_4_ = uVar167;
          auVar236._28_4_ = uVar167;
          auVar239 = ZEXT3264(auVar236);
          auVar55._4_4_ = auVar118._4_4_ * auVar117._4_4_;
          auVar55._0_4_ = auVar118._0_4_ * auVar117._0_4_;
          auVar55._8_4_ = auVar118._8_4_ * auVar117._8_4_;
          auVar55._12_4_ = auVar118._12_4_ * auVar117._12_4_;
          auVar55._16_4_ = auVar118._16_4_ * auVar117._16_4_;
          auVar55._20_4_ = auVar118._20_4_ * auVar117._20_4_;
          auVar55._24_4_ = auVar118._24_4_ * auVar117._24_4_;
          auVar55._28_4_ = auVar119._28_4_;
          auVar107 = vfmsub231ps_fma(auVar55,auVar120,auVar129);
          auVar56._4_4_ = auVar129._4_4_ * auVar128._4_4_;
          auVar56._0_4_ = auVar129._0_4_ * auVar128._0_4_;
          auVar56._8_4_ = auVar129._8_4_ * auVar128._8_4_;
          auVar56._12_4_ = auVar129._12_4_ * auVar128._12_4_;
          auVar56._16_4_ = auVar129._16_4_ * auVar128._16_4_;
          auVar56._20_4_ = auVar129._20_4_ * auVar128._20_4_;
          auVar56._24_4_ = auVar129._24_4_ * auVar128._24_4_;
          auVar56._28_4_ = auVar129._28_4_;
          auVar109 = vfmsub231ps_fma(auVar56,auVar121,auVar118);
          auVar57._4_4_ = auVar120._4_4_ * auVar121._4_4_;
          auVar57._0_4_ = auVar120._0_4_ * auVar121._0_4_;
          auVar57._8_4_ = auVar120._8_4_ * auVar121._8_4_;
          auVar57._12_4_ = auVar120._12_4_ * auVar121._12_4_;
          auVar57._16_4_ = auVar120._16_4_ * auVar121._16_4_;
          auVar57._20_4_ = auVar120._20_4_ * auVar121._20_4_;
          auVar57._24_4_ = auVar120._24_4_ * auVar121._24_4_;
          auVar57._28_4_ = auVar120._28_4_;
          auVar106 = vfmsub231ps_fma(auVar57,auVar128,auVar117);
          auVar113 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar109),ZEXT1632(auVar106));
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT1632(auVar107),
                                     ZEXT1232(ZEXT412(0)) << 0x20);
          auVar119 = vrcp14ps_avx512vl(ZEXT1632(auVar108));
          auVar225 = ZEXT3264(auVar119);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = 0x3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar36._16_4_ = 0x3f800000;
          auVar36._20_4_ = 0x3f800000;
          auVar36._24_4_ = 0x3f800000;
          auVar36._28_4_ = 0x3f800000;
          auVar117 = vfnmadd213ps_avx512vl(auVar119,ZEXT1632(auVar108),auVar36);
          auVar113 = vfmadd132ps_fma(auVar117,auVar119,auVar119);
          auVar221 = ZEXT1664(auVar113);
          auVar58._4_4_ = auVar106._4_4_ * auVar135._4_4_;
          auVar58._0_4_ = auVar106._0_4_ * auVar135._0_4_;
          auVar58._8_4_ = auVar106._8_4_ * auVar135._8_4_;
          auVar58._12_4_ = auVar106._12_4_ * auVar135._12_4_;
          auVar58._16_4_ = fVar184 * 0.0;
          auVar58._20_4_ = fVar190 * 0.0;
          auVar58._24_4_ = fVar185 * 0.0;
          auVar58._28_4_ = iVar1;
          auVar109 = vfmadd231ps_fma(auVar58,auVar126,ZEXT1632(auVar109));
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar127,ZEXT1632(auVar107));
          fVar190 = auVar113._0_4_;
          fVar184 = auVar113._4_4_;
          fVar185 = auVar113._8_4_;
          fVar186 = auVar113._12_4_;
          local_7c0 = ZEXT1632(CONCAT412(auVar109._12_4_ * fVar186,
                                         CONCAT48(auVar109._8_4_ * fVar185,
                                                  CONCAT44(auVar109._4_4_ * fVar184,
                                                           auVar109._0_4_ * fVar190))));
          auVar229 = ZEXT3264(local_7c0);
          auVar173._4_4_ = uVar94;
          auVar173._0_4_ = uVar94;
          auVar173._8_4_ = uVar94;
          auVar173._12_4_ = uVar94;
          auVar173._16_4_ = uVar94;
          auVar173._20_4_ = uVar94;
          auVar173._24_4_ = uVar94;
          auVar173._28_4_ = uVar94;
          uVar187 = vcmpps_avx512vl(local_7c0,auVar236,2);
          uVar30 = vcmpps_avx512vl(auVar173,local_7c0,2);
          bVar101 = (byte)uVar187 & (byte)uVar30 & bVar101;
          if (bVar101 != 0) {
            uVar102 = vcmpps_avx512vl(ZEXT1632(auVar108),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar102 = bVar101 & uVar102;
            if ((char)uVar102 != '\0') {
              fVar200 = auVar122._0_4_ * fVar190;
              fVar207 = auVar122._4_4_ * fVar184;
              auVar59._4_4_ = fVar207;
              auVar59._0_4_ = fVar200;
              fVar103 = auVar122._8_4_ * fVar185;
              auVar59._8_4_ = fVar103;
              fVar104 = auVar122._12_4_ * fVar186;
              auVar59._12_4_ = fVar104;
              fVar157 = auVar122._16_4_ * 0.0;
              auVar59._16_4_ = fVar157;
              fVar158 = auVar122._20_4_ * 0.0;
              auVar59._20_4_ = fVar158;
              fVar159 = auVar122._24_4_ * 0.0;
              auVar59._24_4_ = fVar159;
              auVar59._28_4_ = auVar122._28_4_;
              auVar174._8_4_ = 0x3f800000;
              auVar174._0_8_ = 0x3f8000003f800000;
              auVar174._12_4_ = 0x3f800000;
              auVar174._16_4_ = 0x3f800000;
              auVar174._20_4_ = 0x3f800000;
              auVar174._24_4_ = 0x3f800000;
              auVar174._28_4_ = 0x3f800000;
              auVar119 = vsubps_avx(auVar174,auVar59);
              local_600._0_4_ =
                   (float)((uint)(bVar92 & 1) * (int)fVar200 |
                          (uint)!(bool)(bVar92 & 1) * auVar119._0_4_);
              bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
              local_600._4_4_ =
                   (float)((uint)bVar14 * (int)fVar207 | (uint)!bVar14 * auVar119._4_4_);
              bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
              local_600._8_4_ =
                   (float)((uint)bVar14 * (int)fVar103 | (uint)!bVar14 * auVar119._8_4_);
              bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
              local_600._12_4_ =
                   (float)((uint)bVar14 * (int)fVar104 | (uint)!bVar14 * auVar119._12_4_);
              bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
              local_600._16_4_ =
                   (float)((uint)bVar14 * (int)fVar157 | (uint)!bVar14 * auVar119._16_4_);
              bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
              local_600._20_4_ =
                   (float)((uint)bVar14 * (int)fVar158 | (uint)!bVar14 * auVar119._20_4_);
              bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
              local_600._24_4_ =
                   (float)((uint)bVar14 * (int)fVar159 | (uint)!bVar14 * auVar119._24_4_);
              bVar14 = SUB81(uVar93 >> 7,0);
              local_600._28_4_ =
                   (float)((uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar119._28_4_);
              auVar119 = vsubps_avx(ZEXT1632(auVar203),auVar114);
              auVar113 = vfmadd213ps_fma(auVar119,local_600,auVar114);
              uVar167 = *(undefined4 *)((long)pre->ray_space + sVar100 * 4 + -0x40);
              auVar37._4_4_ = uVar167;
              auVar37._0_4_ = uVar167;
              auVar37._8_4_ = uVar167;
              auVar37._12_4_ = uVar167;
              auVar37._16_4_ = uVar167;
              auVar37._20_4_ = uVar167;
              auVar37._24_4_ = uVar167;
              auVar37._28_4_ = uVar167;
              auVar119 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar113._12_4_ + auVar113._12_4_,
                                                            CONCAT48(auVar113._8_4_ + auVar113._8_4_
                                                                     ,CONCAT44(auVar113._4_4_ +
                                                                               auVar113._4_4_,
                                                                               auVar113._0_4_ +
                                                                               auVar113._0_4_)))),
                                         auVar37);
              uVar96 = vcmpps_avx512vl(local_7c0,auVar119,6);
              uVar102 = uVar102 & uVar96;
              bVar101 = (byte)uVar102;
              if (bVar101 != 0) {
                auVar198._0_4_ = auVar116._0_4_ * fVar190;
                auVar198._4_4_ = auVar116._4_4_ * fVar184;
                auVar198._8_4_ = auVar116._8_4_ * fVar185;
                auVar198._12_4_ = auVar116._12_4_ * fVar186;
                auVar198._16_4_ = auVar116._16_4_ * 0.0;
                auVar198._20_4_ = auVar116._20_4_ * 0.0;
                auVar198._24_4_ = auVar116._24_4_ * 0.0;
                auVar198._28_4_ = 0;
                auVar204._8_4_ = 0x3f800000;
                auVar204._0_8_ = 0x3f8000003f800000;
                auVar204._12_4_ = 0x3f800000;
                auVar204._16_4_ = 0x3f800000;
                auVar204._20_4_ = 0x3f800000;
                auVar204._24_4_ = 0x3f800000;
                auVar204._28_4_ = 0x3f800000;
                auVar119 = vsubps_avx(auVar204,auVar198);
                auVar141._0_4_ =
                     (uint)(bVar92 & 1) * (int)auVar198._0_4_ |
                     (uint)!(bool)(bVar92 & 1) * auVar119._0_4_;
                bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
                auVar141._4_4_ = (uint)bVar14 * (int)auVar198._4_4_ | (uint)!bVar14 * auVar119._4_4_
                ;
                bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
                auVar141._8_4_ = (uint)bVar14 * (int)auVar198._8_4_ | (uint)!bVar14 * auVar119._8_4_
                ;
                bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
                auVar141._12_4_ =
                     (uint)bVar14 * (int)auVar198._12_4_ | (uint)!bVar14 * auVar119._12_4_;
                bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
                auVar141._16_4_ =
                     (uint)bVar14 * (int)auVar198._16_4_ | (uint)!bVar14 * auVar119._16_4_;
                bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
                auVar141._20_4_ =
                     (uint)bVar14 * (int)auVar198._20_4_ | (uint)!bVar14 * auVar119._20_4_;
                bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
                auVar141._24_4_ =
                     (uint)bVar14 * (int)auVar198._24_4_ | (uint)!bVar14 * auVar119._24_4_;
                auVar141._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar119._28_4_;
                auVar38._8_4_ = 0x40000000;
                auVar38._0_8_ = 0x4000000040000000;
                auVar38._12_4_ = 0x40000000;
                auVar38._16_4_ = 0x40000000;
                auVar38._20_4_ = 0x40000000;
                auVar38._24_4_ = 0x40000000;
                auVar38._28_4_ = 0x40000000;
                local_5e0 = vfmsub132ps_avx512vl(auVar141,auVar204,auVar38);
                local_5a0 = 0;
                local_580 = local_840;
                uStack_578 = uStack_838;
                local_570 = local_850;
                uStack_568 = uStack_848;
                local_560 = local_860;
                uStack_558 = uStack_858;
                if ((pGVar11->mask & *(uint *)(ray + sVar100 * 4 + 0x240)) != 0) {
                  local_7a0 = SUB84(pGVar11,0);
                  uStack_79c = (undefined4)((ulong)pGVar11 >> 0x20);
                  fVar190 = 1.0 / auVar231._0_4_;
                  local_540[0] = fVar190 * (local_600._0_4_ + 0.0);
                  local_540[1] = fVar190 * (local_600._4_4_ + 1.0);
                  local_540[2] = fVar190 * (local_600._8_4_ + 2.0);
                  local_540[3] = fVar190 * (local_600._12_4_ + 3.0);
                  fStack_530 = fVar190 * (local_600._16_4_ + 4.0);
                  fStack_52c = fVar190 * (local_600._20_4_ + 5.0);
                  fStack_528 = fVar190 * (local_600._24_4_ + 6.0);
                  fStack_524 = local_600._28_4_ + 7.0;
                  local_520 = local_5e0;
                  local_500 = local_7c0;
                  auVar175._8_4_ = 0x7f800000;
                  auVar175._0_8_ = 0x7f8000007f800000;
                  auVar175._12_4_ = 0x7f800000;
                  auVar175._16_4_ = 0x7f800000;
                  auVar175._20_4_ = 0x7f800000;
                  auVar175._24_4_ = 0x7f800000;
                  auVar175._28_4_ = 0x7f800000;
                  auVar119 = vblendmps_avx512vl(auVar175,local_7c0);
                  auVar142._0_4_ =
                       (uint)(bVar101 & 1) * auVar119._0_4_ |
                       (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
                  auVar142._4_4_ = (uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
                  auVar142._8_4_ = (uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                  auVar142._12_4_ = (uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
                  auVar142._16_4_ = (uint)bVar14 * auVar119._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
                  auVar142._20_4_ = (uint)bVar14 * auVar119._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
                  auVar142._24_4_ = (uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = SUB81(uVar102 >> 7,0);
                  auVar142._28_4_ = (uint)bVar14 * auVar119._28_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar119 = vshufps_avx(auVar142,auVar142,0xb1);
                  auVar119 = vminps_avx(auVar142,auVar119);
                  auVar117 = vshufpd_avx(auVar119,auVar119,5);
                  auVar119 = vminps_avx(auVar119,auVar117);
                  auVar117 = vpermpd_avx2(auVar119,0x4e);
                  auVar119 = vminps_avx(auVar119,auVar117);
                  uVar187 = vcmpps_avx512vl(auVar142,auVar119,0);
                  uVar94 = (uint)uVar102;
                  if (((byte)uVar187 & bVar101) != 0) {
                    uVar94 = (uint)((byte)uVar187 & bVar101);
                  }
                  uVar95 = 0;
                  for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                    uVar95 = uVar95 + 1;
                  }
                  uVar93 = (ulong)uVar95;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar218 = vpbroadcastd_avx512f();
                    local_440 = vmovdqa64_avx512f(auVar218);
                    auVar218 = vpbroadcastd_avx512f();
                    local_480 = vmovdqa64_avx512f(auVar218);
                    local_7e0 = auVar124;
                    local_5c0 = local_7c0;
                    local_59c = iVar9;
                    local_590 = auVar105;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_540[uVar93]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_520 + uVar93 * 4)));
                      *(undefined4 *)(ray + sVar100 * 4 + 0x200) =
                           *(undefined4 *)(local_500 + uVar93 * 4);
                      local_830.context = context->user;
                      fVar186 = local_200._0_4_;
                      fVar190 = 1.0 - fVar186;
                      auVar35._8_4_ = 0x80000000;
                      auVar35._0_8_ = 0x8000000080000000;
                      auVar35._12_4_ = 0x80000000;
                      auVar109 = vxorps_avx512vl(ZEXT416((uint)fVar190),auVar35);
                      auVar113 = ZEXT416((uint)(fVar186 * fVar190 * 4.0));
                      auVar108 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar113);
                      auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),
                                                 auVar113);
                      auVar225 = ZEXT464(0x3f000000);
                      fVar190 = fVar190 * auVar109._0_4_ * 0.5;
                      fVar184 = auVar108._0_4_ * 0.5;
                      fVar185 = auVar113._0_4_ * 0.5;
                      fVar186 = fVar186 * fVar186 * 0.5;
                      auVar220._0_4_ = fVar186 * fVar201;
                      auVar220._4_4_ = fVar186 * fVar166;
                      auVar220._8_4_ = fVar186 * fVar182;
                      auVar220._12_4_ = fVar186 * fVar183;
                      auVar170._4_4_ = fVar185;
                      auVar170._0_4_ = fVar185;
                      auVar170._8_4_ = fVar185;
                      auVar170._12_4_ = fVar185;
                      auVar113 = vfmadd132ps_fma(auVar170,auVar220,auVar6);
                      auVar213._4_4_ = fVar184;
                      auVar213._0_4_ = fVar184;
                      auVar213._8_4_ = fVar184;
                      auVar213._12_4_ = fVar184;
                      auVar113 = vfmadd132ps_fma(auVar213,auVar113,auVar29);
                      auVar171._4_4_ = fVar190;
                      auVar171._0_4_ = fVar190;
                      auVar171._8_4_ = fVar190;
                      auVar171._12_4_ = fVar190;
                      auVar113 = vfmadd213ps_fma(auVar171,auVar105,auVar113);
                      auVar156 = vbroadcastss_avx512f(auVar113);
                      auVar218 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar218 = vpermps_avx512f(auVar218,ZEXT1664(auVar113));
                      auVar221 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar221,ZEXT1664(auVar113));
                      local_2c0[0] = (RTCHitN)auVar156[0];
                      local_2c0[1] = (RTCHitN)auVar156[1];
                      local_2c0[2] = (RTCHitN)auVar156[2];
                      local_2c0[3] = (RTCHitN)auVar156[3];
                      local_2c0[4] = (RTCHitN)auVar156[4];
                      local_2c0[5] = (RTCHitN)auVar156[5];
                      local_2c0[6] = (RTCHitN)auVar156[6];
                      local_2c0[7] = (RTCHitN)auVar156[7];
                      local_2c0[8] = (RTCHitN)auVar156[8];
                      local_2c0[9] = (RTCHitN)auVar156[9];
                      local_2c0[10] = (RTCHitN)auVar156[10];
                      local_2c0[0xb] = (RTCHitN)auVar156[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar156[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar156[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar156[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar156[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar156[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar156[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar156[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar156[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar156[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar156[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar156[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar156[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar156[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar156[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar156[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar156[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar156[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar156[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar156[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar156[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar156[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar156[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar156[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar156[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar156[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar156[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar156[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar156[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar156[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar156[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar156[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar156[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar156[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar156[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar156[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar156[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar156[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar156[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar156[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar156[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar156[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar156[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar156[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar156[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar156[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar156[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar156[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar156[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar156[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar156[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar156[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar156[0x3f];
                      local_280 = auVar218;
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar156 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar156);
                      auVar119 = vpcmpeqd_avx2(auVar156._0_32_,auVar156._0_32_);
                      local_7e8[3] = auVar119;
                      local_7e8[2] = auVar119;
                      local_7e8[1] = auVar119;
                      *local_7e8 = auVar119;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]));
                      auVar156 = vmovdqa64_avx512f(local_300);
                      local_740 = vmovdqa64_avx512f(auVar156);
                      local_830.valid = (int *)local_740;
                      local_830.geometryUserPtr = *(void **)(CONCAT44(uStack_79c,local_7a0) + 0x18);
                      local_830.hit = local_2c0;
                      local_830.N = 0x10;
                      pcVar13 = *(code **)(CONCAT44(uStack_79c,local_7a0) + 0x40);
                      local_760 = auVar239._0_32_;
                      local_830.ray = (RTCRayN *)ray;
                      if (pcVar13 != (code *)0x0) {
                        auVar218 = ZEXT1664(auVar218._0_16_);
                        auVar221 = ZEXT1664(auVar221._0_16_);
                        auVar225 = ZEXT1664(auVar225._0_16_);
                        (*pcVar13)(&local_830);
                        auVar229 = ZEXT3264(local_7c0);
                        auVar239 = ZEXT3264(local_760);
                        auVar240 = ZEXT3264(local_7e0);
                        auVar242 = ZEXT464(0x35000000);
                        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar181 = ZEXT1664(auVar113);
                        auVar119 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar241 = ZEXT3264(auVar119);
                        auVar156 = vmovdqa64_avx512f(local_740);
                        sVar100 = local_7f0;
                      }
                      uVar187 = vptestmd_avx512f(auVar156,auVar156);
                      if ((short)uVar187 == 0) {
LAB_01cc254f:
                        *(int *)(ray + sVar100 * 4 + 0x200) = auVar239._0_4_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(CONCAT44(uStack_79c,local_7a0) + 0x3e) & 0x40) != 0)))) {
                          auVar218 = ZEXT1664(auVar218._0_16_);
                          auVar221 = ZEXT1664(auVar221._0_16_);
                          auVar225 = ZEXT1664(auVar225._0_16_);
                          (*p_Var12)(&local_830);
                          auVar229 = ZEXT3264(local_7c0);
                          auVar239 = ZEXT3264(local_760);
                          auVar240 = ZEXT3264(local_7e0);
                          auVar242 = ZEXT464(0x35000000);
                          auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar181 = ZEXT1664(auVar113);
                          auVar119 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar241 = ZEXT3264(auVar119);
                          auVar156 = vmovdqa64_avx512f(local_740);
                          sVar100 = local_7f0;
                        }
                        uVar96 = vptestmd_avx512f(auVar156,auVar156);
                        if ((short)uVar96 == 0) goto LAB_01cc254f;
                        iVar1 = *(int *)(local_830.hit + 4);
                        iVar2 = *(int *)(local_830.hit + 8);
                        iVar78 = *(int *)(local_830.hit + 0xc);
                        iVar79 = *(int *)(local_830.hit + 0x10);
                        iVar80 = *(int *)(local_830.hit + 0x14);
                        iVar81 = *(int *)(local_830.hit + 0x18);
                        iVar82 = *(int *)(local_830.hit + 0x1c);
                        iVar83 = *(int *)(local_830.hit + 0x20);
                        iVar84 = *(int *)(local_830.hit + 0x24);
                        iVar85 = *(int *)(local_830.hit + 0x28);
                        iVar86 = *(int *)(local_830.hit + 0x2c);
                        iVar87 = *(int *)(local_830.hit + 0x30);
                        iVar88 = *(int *)(local_830.hit + 0x34);
                        iVar89 = *(int *)(local_830.hit + 0x38);
                        iVar90 = *(int *)(local_830.hit + 0x3c);
                        bVar101 = (byte)uVar96;
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
                        bVar92 = (byte)(uVar96 >> 8);
                        bVar22 = (bool)((byte)(uVar96 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar96 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar96 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar96 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar96 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar96 >> 0xe) & 1);
                        bVar28 = SUB81(uVar96 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x300) =
                             (uint)(bVar101 & 1) * *(int *)local_830.hit |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_830.ray + 0x300);
                        *(uint *)(local_830.ray + 0x304) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 0x304);
                        *(uint *)(local_830.ray + 0x308) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x308);
                        *(uint *)(local_830.ray + 0x30c) =
                             (uint)bVar16 * iVar78 | (uint)!bVar16 * *(int *)(local_830.ray + 0x30c)
                        ;
                        *(uint *)(local_830.ray + 0x310) =
                             (uint)bVar17 * iVar79 | (uint)!bVar17 * *(int *)(local_830.ray + 0x310)
                        ;
                        *(uint *)(local_830.ray + 0x314) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_830.ray + 0x314)
                        ;
                        *(uint *)(local_830.ray + 0x318) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_830.ray + 0x318)
                        ;
                        *(uint *)(local_830.ray + 0x31c) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_830.ray + 0x31c)
                        ;
                        *(uint *)(local_830.ray + 800) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 800);
                        *(uint *)(local_830.ray + 0x324) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x324)
                        ;
                        *(uint *)(local_830.ray + 0x328) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 0x328)
                        ;
                        *(uint *)(local_830.ray + 0x32c) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x32c)
                        ;
                        *(uint *)(local_830.ray + 0x330) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x330)
                        ;
                        *(uint *)(local_830.ray + 0x334) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_830.ray + 0x334)
                        ;
                        *(uint *)(local_830.ray + 0x338) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_830.ray + 0x338)
                        ;
                        *(uint *)(local_830.ray + 0x33c) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_830.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_830.hit + 0x44);
                        iVar2 = *(int *)(local_830.hit + 0x48);
                        iVar78 = *(int *)(local_830.hit + 0x4c);
                        iVar79 = *(int *)(local_830.hit + 0x50);
                        iVar80 = *(int *)(local_830.hit + 0x54);
                        iVar81 = *(int *)(local_830.hit + 0x58);
                        iVar82 = *(int *)(local_830.hit + 0x5c);
                        iVar83 = *(int *)(local_830.hit + 0x60);
                        iVar84 = *(int *)(local_830.hit + 100);
                        iVar85 = *(int *)(local_830.hit + 0x68);
                        iVar86 = *(int *)(local_830.hit + 0x6c);
                        iVar87 = *(int *)(local_830.hit + 0x70);
                        iVar88 = *(int *)(local_830.hit + 0x74);
                        iVar89 = *(int *)(local_830.hit + 0x78);
                        iVar90 = *(int *)(local_830.hit + 0x7c);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar96 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar96 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar96 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar96 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar96 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar96 >> 0xe) & 1);
                        bVar28 = SUB81(uVar96 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x340) =
                             (uint)(bVar101 & 1) * *(int *)(local_830.hit + 0x40) |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_830.ray + 0x340);
                        *(uint *)(local_830.ray + 0x344) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 0x344);
                        *(uint *)(local_830.ray + 0x348) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x348);
                        *(uint *)(local_830.ray + 0x34c) =
                             (uint)bVar16 * iVar78 | (uint)!bVar16 * *(int *)(local_830.ray + 0x34c)
                        ;
                        *(uint *)(local_830.ray + 0x350) =
                             (uint)bVar17 * iVar79 | (uint)!bVar17 * *(int *)(local_830.ray + 0x350)
                        ;
                        *(uint *)(local_830.ray + 0x354) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_830.ray + 0x354)
                        ;
                        *(uint *)(local_830.ray + 0x358) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_830.ray + 0x358)
                        ;
                        *(uint *)(local_830.ray + 0x35c) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_830.ray + 0x35c)
                        ;
                        *(uint *)(local_830.ray + 0x360) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 0x360);
                        *(uint *)(local_830.ray + 0x364) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x364)
                        ;
                        *(uint *)(local_830.ray + 0x368) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 0x368)
                        ;
                        *(uint *)(local_830.ray + 0x36c) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x36c)
                        ;
                        *(uint *)(local_830.ray + 0x370) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x370)
                        ;
                        *(uint *)(local_830.ray + 0x374) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_830.ray + 0x374)
                        ;
                        *(uint *)(local_830.ray + 0x378) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_830.ray + 0x378)
                        ;
                        *(uint *)(local_830.ray + 0x37c) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_830.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_830.hit + 0x84);
                        iVar2 = *(int *)(local_830.hit + 0x88);
                        iVar78 = *(int *)(local_830.hit + 0x8c);
                        iVar79 = *(int *)(local_830.hit + 0x90);
                        iVar80 = *(int *)(local_830.hit + 0x94);
                        iVar81 = *(int *)(local_830.hit + 0x98);
                        iVar82 = *(int *)(local_830.hit + 0x9c);
                        iVar83 = *(int *)(local_830.hit + 0xa0);
                        iVar84 = *(int *)(local_830.hit + 0xa4);
                        iVar85 = *(int *)(local_830.hit + 0xa8);
                        iVar86 = *(int *)(local_830.hit + 0xac);
                        iVar87 = *(int *)(local_830.hit + 0xb0);
                        iVar88 = *(int *)(local_830.hit + 0xb4);
                        iVar89 = *(int *)(local_830.hit + 0xb8);
                        iVar90 = *(int *)(local_830.hit + 0xbc);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar96 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar96 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar96 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar96 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar96 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar96 >> 0xe) & 1);
                        bVar28 = SUB81(uVar96 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x380) =
                             (uint)(bVar101 & 1) * *(int *)(local_830.hit + 0x80) |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_830.ray + 0x380);
                        *(uint *)(local_830.ray + 900) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 900);
                        *(uint *)(local_830.ray + 0x388) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x388);
                        *(uint *)(local_830.ray + 0x38c) =
                             (uint)bVar16 * iVar78 | (uint)!bVar16 * *(int *)(local_830.ray + 0x38c)
                        ;
                        *(uint *)(local_830.ray + 0x390) =
                             (uint)bVar17 * iVar79 | (uint)!bVar17 * *(int *)(local_830.ray + 0x390)
                        ;
                        *(uint *)(local_830.ray + 0x394) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_830.ray + 0x394)
                        ;
                        *(uint *)(local_830.ray + 0x398) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_830.ray + 0x398)
                        ;
                        *(uint *)(local_830.ray + 0x39c) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_830.ray + 0x39c)
                        ;
                        *(uint *)(local_830.ray + 0x3a0) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 0x3a0);
                        *(uint *)(local_830.ray + 0x3a4) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3a4)
                        ;
                        *(uint *)(local_830.ray + 0x3a8) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3a8)
                        ;
                        *(uint *)(local_830.ray + 0x3ac) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3ac)
                        ;
                        *(uint *)(local_830.ray + 0x3b0) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3b0)
                        ;
                        *(uint *)(local_830.ray + 0x3b4) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3b4)
                        ;
                        *(uint *)(local_830.ray + 0x3b8) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_830.ray + 0x3b8)
                        ;
                        *(uint *)(local_830.ray + 0x3bc) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_830.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_830.hit + 0xc4);
                        iVar2 = *(int *)(local_830.hit + 200);
                        iVar78 = *(int *)(local_830.hit + 0xcc);
                        iVar79 = *(int *)(local_830.hit + 0xd0);
                        iVar80 = *(int *)(local_830.hit + 0xd4);
                        iVar81 = *(int *)(local_830.hit + 0xd8);
                        iVar82 = *(int *)(local_830.hit + 0xdc);
                        iVar83 = *(int *)(local_830.hit + 0xe0);
                        iVar84 = *(int *)(local_830.hit + 0xe4);
                        iVar85 = *(int *)(local_830.hit + 0xe8);
                        iVar86 = *(int *)(local_830.hit + 0xec);
                        iVar87 = *(int *)(local_830.hit + 0xf0);
                        iVar88 = *(int *)(local_830.hit + 0xf4);
                        iVar89 = *(int *)(local_830.hit + 0xf8);
                        iVar90 = *(int *)(local_830.hit + 0xfc);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar96 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar96 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar96 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar96 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar96 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar96 >> 0xe) & 1);
                        bVar28 = SUB81(uVar96 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x3c0) =
                             (uint)(bVar101 & 1) * *(int *)(local_830.hit + 0xc0) |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_830.ray + 0x3c0);
                        *(uint *)(local_830.ray + 0x3c4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 0x3c4);
                        *(uint *)(local_830.ray + 0x3c8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x3c8);
                        *(uint *)(local_830.ray + 0x3cc) =
                             (uint)bVar16 * iVar78 | (uint)!bVar16 * *(int *)(local_830.ray + 0x3cc)
                        ;
                        *(uint *)(local_830.ray + 0x3d0) =
                             (uint)bVar17 * iVar79 | (uint)!bVar17 * *(int *)(local_830.ray + 0x3d0)
                        ;
                        *(uint *)(local_830.ray + 0x3d4) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_830.ray + 0x3d4)
                        ;
                        *(uint *)(local_830.ray + 0x3d8) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_830.ray + 0x3d8)
                        ;
                        *(uint *)(local_830.ray + 0x3dc) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_830.ray + 0x3dc)
                        ;
                        *(uint *)(local_830.ray + 0x3e0) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 0x3e0);
                        *(uint *)(local_830.ray + 0x3e4) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3e4)
                        ;
                        *(uint *)(local_830.ray + 1000) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 1000);
                        *(uint *)(local_830.ray + 0x3ec) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3ec)
                        ;
                        *(uint *)(local_830.ray + 0x3f0) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3f0)
                        ;
                        *(uint *)(local_830.ray + 0x3f4) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3f4)
                        ;
                        *(uint *)(local_830.ray + 0x3f8) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_830.ray + 0x3f8)
                        ;
                        *(uint *)(local_830.ray + 0x3fc) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_830.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_830.hit + 0x104);
                        iVar2 = *(int *)(local_830.hit + 0x108);
                        iVar78 = *(int *)(local_830.hit + 0x10c);
                        iVar79 = *(int *)(local_830.hit + 0x110);
                        iVar80 = *(int *)(local_830.hit + 0x114);
                        iVar81 = *(int *)(local_830.hit + 0x118);
                        iVar82 = *(int *)(local_830.hit + 0x11c);
                        iVar83 = *(int *)(local_830.hit + 0x120);
                        iVar84 = *(int *)(local_830.hit + 0x124);
                        iVar85 = *(int *)(local_830.hit + 0x128);
                        iVar86 = *(int *)(local_830.hit + 300);
                        iVar87 = *(int *)(local_830.hit + 0x130);
                        iVar88 = *(int *)(local_830.hit + 0x134);
                        iVar89 = *(int *)(local_830.hit + 0x138);
                        iVar90 = *(int *)(local_830.hit + 0x13c);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar96 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar96 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar96 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar96 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar96 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar96 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar96 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar96 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar96 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar96 >> 0xe) & 1);
                        bVar28 = SUB81(uVar96 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x400) =
                             (uint)(bVar101 & 1) * *(int *)(local_830.hit + 0x100) |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_830.ray + 0x400);
                        *(uint *)(local_830.ray + 0x404) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 0x404);
                        *(uint *)(local_830.ray + 0x408) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x408);
                        *(uint *)(local_830.ray + 0x40c) =
                             (uint)bVar16 * iVar78 | (uint)!bVar16 * *(int *)(local_830.ray + 0x40c)
                        ;
                        *(uint *)(local_830.ray + 0x410) =
                             (uint)bVar17 * iVar79 | (uint)!bVar17 * *(int *)(local_830.ray + 0x410)
                        ;
                        *(uint *)(local_830.ray + 0x414) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_830.ray + 0x414)
                        ;
                        *(uint *)(local_830.ray + 0x418) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_830.ray + 0x418)
                        ;
                        *(uint *)(local_830.ray + 0x41c) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_830.ray + 0x41c)
                        ;
                        *(uint *)(local_830.ray + 0x420) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 0x420);
                        *(uint *)(local_830.ray + 0x424) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_830.ray + 0x424)
                        ;
                        *(uint *)(local_830.ray + 0x428) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_830.ray + 0x428)
                        ;
                        *(uint *)(local_830.ray + 0x42c) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_830.ray + 0x42c)
                        ;
                        *(uint *)(local_830.ray + 0x430) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_830.ray + 0x430)
                        ;
                        *(uint *)(local_830.ray + 0x434) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_830.ray + 0x434)
                        ;
                        *(uint *)(local_830.ray + 0x438) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_830.ray + 0x438)
                        ;
                        *(uint *)(local_830.ray + 0x43c) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_830.ray + 0x43c)
                        ;
                        auVar239 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140));
                        auVar239 = vmovdqu32_avx512f(auVar239);
                        *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar239;
                        auVar239 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180));
                        auVar239 = vmovdqu32_avx512f(auVar239);
                        *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar239;
                        auVar239 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0));
                        auVar239 = vmovdqa32_avx512f(auVar239);
                        *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar239;
                        auVar239 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200));
                        auVar239 = vmovdqa32_avx512f(auVar239);
                        *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar239;
                        auVar239 = ZEXT464(*(uint *)(ray + sVar100 * 4 + 0x200));
                      }
                      auVar124 = auVar240._0_32_;
                      bVar101 = ~(byte)(1 << ((uint)uVar93 & 0x1f)) & (byte)uVar102;
                      uVar167 = auVar239._0_4_;
                      auVar179._4_4_ = uVar167;
                      auVar179._0_4_ = uVar167;
                      auVar179._8_4_ = uVar167;
                      auVar179._12_4_ = uVar167;
                      auVar179._16_4_ = uVar167;
                      auVar179._20_4_ = uVar167;
                      auVar179._24_4_ = uVar167;
                      auVar179._28_4_ = uVar167;
                      uVar187 = vcmpps_avx512vl(auVar229._0_32_,auVar179,2);
                      if ((bVar101 & (byte)uVar187) == 0) goto LAB_01cc13b9;
                      bVar101 = bVar101 & (byte)uVar187;
                      uVar102 = (ulong)bVar101;
                      auVar180._8_4_ = 0x7f800000;
                      auVar180._0_8_ = 0x7f8000007f800000;
                      auVar180._12_4_ = 0x7f800000;
                      auVar180._16_4_ = 0x7f800000;
                      auVar180._20_4_ = 0x7f800000;
                      auVar180._24_4_ = 0x7f800000;
                      auVar180._28_4_ = 0x7f800000;
                      auVar119 = vblendmps_avx512vl(auVar180,auVar229._0_32_);
                      auVar155._0_4_ =
                           (uint)(bVar101 & 1) * auVar119._0_4_ |
                           (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                      bVar14 = (bool)(bVar101 >> 1 & 1);
                      auVar155._4_4_ = (uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar101 >> 2 & 1);
                      auVar155._8_4_ = (uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar101 >> 3 & 1);
                      auVar155._12_4_ = (uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar101 >> 4 & 1);
                      auVar155._16_4_ = (uint)bVar14 * auVar119._16_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar101 >> 5 & 1);
                      auVar155._20_4_ = (uint)bVar14 * auVar119._20_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar101 >> 6 & 1);
                      auVar155._24_4_ = (uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * 0x7f800000;
                      auVar155._28_4_ =
                           (uint)(bVar101 >> 7) * auVar119._28_4_ |
                           (uint)!(bool)(bVar101 >> 7) * 0x7f800000;
                      auVar119 = vshufps_avx(auVar155,auVar155,0xb1);
                      auVar119 = vminps_avx(auVar155,auVar119);
                      auVar117 = vshufpd_avx(auVar119,auVar119,5);
                      auVar119 = vminps_avx(auVar119,auVar117);
                      auVar117 = vpermpd_avx2(auVar119,0x4e);
                      auVar119 = vminps_avx(auVar119,auVar117);
                      uVar187 = vcmpps_avx512vl(auVar155,auVar119,0);
                      bVar92 = (byte)uVar187 & bVar101;
                      if (bVar92 != 0) {
                        bVar101 = bVar92;
                      }
                      uVar94 = 0;
                      for (uVar95 = (uint)bVar101; (uVar95 & 1) == 0;
                          uVar95 = uVar95 >> 1 | 0x80000000) {
                        uVar94 = uVar94 + 1;
                      }
                      uVar93 = (ulong)uVar94;
                    } while( true );
                  }
                  fVar190 = local_540[uVar93];
                  uVar167 = *(undefined4 *)(local_520 + uVar93 * 4);
                  fVar184 = 1.0 - fVar190;
                  auVar32._8_4_ = 0x80000000;
                  auVar32._0_8_ = 0x8000000080000000;
                  auVar32._12_4_ = 0x80000000;
                  auVar109 = vxorps_avx512vl(ZEXT416((uint)fVar184),auVar32);
                  auVar113 = ZEXT416((uint)(fVar190 * fVar184 * 4.0));
                  auVar108 = vfnmsub213ss_fma(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),auVar113
                                             );
                  auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),auVar113)
                  ;
                  fVar184 = fVar184 * auVar109._0_4_ * 0.5;
                  fVar185 = auVar108._0_4_ * 0.5;
                  auVar221 = ZEXT464((uint)fVar185);
                  fVar186 = auVar113._0_4_ * 0.5;
                  fVar200 = fVar190 * fVar190 * 0.5;
                  auVar208._0_4_ = fVar200 * fVar201;
                  auVar208._4_4_ = fVar200 * fVar166;
                  auVar208._8_4_ = fVar200 * fVar182;
                  auVar208._12_4_ = fVar200 * fVar183;
                  auVar193._4_4_ = fVar186;
                  auVar193._0_4_ = fVar186;
                  auVar193._8_4_ = fVar186;
                  auVar193._12_4_ = fVar186;
                  auVar113 = vfmadd132ps_fma(auVar193,auVar208,auVar6);
                  auVar209._4_4_ = fVar185;
                  auVar209._0_4_ = fVar185;
                  auVar209._8_4_ = fVar185;
                  auVar209._12_4_ = fVar185;
                  auVar113 = vfmadd132ps_fma(auVar209,auVar113,auVar29);
                  auVar218 = ZEXT1664(auVar113);
                  auVar194._4_4_ = fVar184;
                  auVar194._0_4_ = fVar184;
                  auVar194._8_4_ = fVar184;
                  auVar194._12_4_ = fVar184;
                  auVar113 = vfmadd213ps_fma(auVar194,auVar105,auVar113);
                  *(undefined4 *)(ray + sVar100 * 4 + 0x200) =
                       *(undefined4 *)(local_500 + uVar93 * 4);
                  *(int *)(ray + sVar100 * 4 + 0x300) = auVar113._0_4_;
                  uVar10 = vextractps_avx(auVar113,1);
                  *(undefined4 *)(ray + sVar100 * 4 + 0x340) = uVar10;
                  uVar10 = vextractps_avx(auVar113,2);
                  *(undefined4 *)(ray + sVar100 * 4 + 0x380) = uVar10;
                  *(float *)(ray + sVar100 * 4 + 0x3c0) = fVar190;
                  *(undefined4 *)(ray + sVar100 * 4 + 0x400) = uVar167;
                  *(undefined4 *)(ray + sVar100 * 4 + 0x440) = uVar3;
                  *(uint *)(ray + sVar100 * 4 + 0x480) = uVar98;
                  *(uint *)(ray + sVar100 * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + sVar100 * 4 + 0x500) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01cc13b9:
      if (8 < iVar9) {
        auVar119 = vpbroadcastd_avx512vl();
        auVar229 = ZEXT3264(auVar119);
        local_7a0 = local_880;
        uStack_79c = local_880;
        uStack_798 = local_880;
        uStack_794 = local_880;
        uStack_790 = local_880;
        uStack_78c = local_880;
        uStack_788 = local_880;
        uStack_784 = local_880;
        local_760._4_4_ = local_780._0_4_;
        local_760._0_4_ = local_780._0_4_;
        local_760._8_4_ = local_780._0_4_;
        local_760._12_4_ = local_780._0_4_;
        local_760._16_4_ = local_780._0_4_;
        local_760._20_4_ = local_780._0_4_;
        local_760._24_4_ = local_780._0_4_;
        local_760._28_4_ = local_780._0_4_;
        local_3c0 = 1.0 / (float)local_800._0_4_;
        fStack_3bc = local_3c0;
        fStack_3b8 = local_3c0;
        fStack_3b4 = local_3c0;
        fStack_3b0 = local_3c0;
        fStack_3ac = local_3c0;
        fStack_3a8 = local_3c0;
        fStack_3a4 = local_3c0;
        auVar240 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar240);
        auVar240 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar240);
        lVar97 = 8;
        local_7e0 = auVar124;
LAB_01cc1463:
        auVar119 = vpbroadcastd_avx512vl();
        auVar119 = vpor_avx2(auVar119,_DAT_01fe9900);
        uVar30 = vpcmpgtd_avx512vl(auVar229._0_32_,auVar119);
        auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar97 * 4 + lVar31);
        auVar117 = *(undefined1 (*) [32])(lVar31 + 0x21aefac + lVar97 * 4);
        auVar129 = *(undefined1 (*) [32])(lVar31 + 0x21af430 + lVar97 * 4);
        auVar128 = *(undefined1 (*) [32])(lVar31 + 0x21af8b4 + lVar97 * 4);
        auVar240._0_4_ = auVar128._0_4_ * (float)local_6e0._0_4_;
        auVar240._4_4_ = auVar128._4_4_ * (float)local_6e0._4_4_;
        auVar240._8_4_ = auVar128._8_4_ * fStack_6d8;
        auVar240._12_4_ = auVar128._12_4_ * fStack_6d4;
        auVar240._16_4_ = auVar128._16_4_ * fStack_6d0;
        auVar240._20_4_ = auVar128._20_4_ * fStack_6cc;
        auVar240._28_36_ = auVar221._28_36_;
        auVar240._24_4_ = auVar128._24_4_ * fStack_6c8;
        auVar221._0_4_ = auVar128._0_4_ * (float)local_700._0_4_;
        auVar221._4_4_ = auVar128._4_4_ * (float)local_700._4_4_;
        auVar221._8_4_ = auVar128._8_4_ * fStack_6f8;
        auVar221._12_4_ = auVar128._12_4_ * fStack_6f4;
        auVar221._16_4_ = auVar128._16_4_ * fStack_6f0;
        auVar221._20_4_ = auVar128._20_4_ * fStack_6ec;
        auVar221._28_36_ = auVar218._28_36_;
        auVar221._24_4_ = auVar128._24_4_ * fStack_6e8;
        auVar120 = vmulps_avx512vl(local_3a0,auVar128);
        auVar118 = vfmadd231ps_avx512vl(auVar240._0_32_,auVar129,local_6a0);
        auVar127 = vfmadd231ps_avx512vl(auVar221._0_32_,auVar129,local_6c0);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar129,local_380);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar117,local_660);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar117,local_680);
        auVar126 = vfmadd231ps_avx512vl(auVar120,auVar117,local_360);
        auVar113 = vfmadd231ps_fma(auVar118,auVar119,local_620);
        auVar221 = ZEXT1664(auVar113);
        auVar108 = vfmadd231ps_fma(auVar127,auVar119,local_640);
        auVar218 = ZEXT1664(auVar108);
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar97 * 4 + lVar31);
        auVar118 = *(undefined1 (*) [32])(lVar31 + 0x21b13cc + lVar97 * 4);
        auVar116 = vfmadd231ps_avx512vl(auVar126,auVar119,local_340);
        auVar127 = *(undefined1 (*) [32])(lVar31 + 0x21b1850 + lVar97 * 4);
        auVar126 = *(undefined1 (*) [32])(lVar31 + 0x21b1cd4 + lVar97 * 4);
        auVar239._0_4_ = auVar126._0_4_ * (float)local_6e0._0_4_;
        auVar239._4_4_ = auVar126._4_4_ * (float)local_6e0._4_4_;
        auVar239._8_4_ = auVar126._8_4_ * fStack_6d8;
        auVar239._12_4_ = auVar126._12_4_ * fStack_6d4;
        auVar239._16_4_ = auVar126._16_4_ * fStack_6d0;
        auVar239._20_4_ = auVar126._20_4_ * fStack_6cc;
        auVar239._28_36_ = auVar225._28_36_;
        auVar239._24_4_ = auVar126._24_4_ * fStack_6c8;
        auVar60._4_4_ = auVar126._4_4_ * (float)local_700._4_4_;
        auVar60._0_4_ = auVar126._0_4_ * (float)local_700._0_4_;
        auVar60._8_4_ = auVar126._8_4_ * fStack_6f8;
        auVar60._12_4_ = auVar126._12_4_ * fStack_6f4;
        auVar60._16_4_ = auVar126._16_4_ * fStack_6f0;
        auVar60._20_4_ = auVar126._20_4_ * fStack_6ec;
        auVar60._24_4_ = auVar126._24_4_ * fStack_6e8;
        auVar60._28_4_ = uStack_6e4;
        auVar121 = vmulps_avx512vl(local_3a0,auVar126);
        auVar122 = vfmadd231ps_avx512vl(auVar239._0_32_,auVar127,local_6a0);
        auVar123 = vfmadd231ps_avx512vl(auVar60,auVar127,local_6c0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar127,local_380);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar118,local_660);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar118,local_680);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,local_360);
        auVar109 = vfmadd231ps_fma(auVar122,auVar120,local_620);
        auVar225 = ZEXT1664(auVar109);
        auVar107 = vfmadd231ps_fma(auVar123,auVar120,local_640);
        auVar123 = vfmadd231ps_avx512vl(auVar121,auVar120,local_340);
        auVar124 = vmaxps_avx512vl(auVar116,auVar123);
        auVar121 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar113));
        auVar122 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar108));
        auVar114 = vmulps_avx512vl(ZEXT1632(auVar108),auVar121);
        auVar115 = vmulps_avx512vl(ZEXT1632(auVar113),auVar122);
        auVar114 = vsubps_avx512vl(auVar114,auVar115);
        auVar115 = vmulps_avx512vl(auVar122,auVar122);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar121,auVar121);
        auVar124 = vmulps_avx512vl(auVar124,auVar124);
        auVar124 = vmulps_avx512vl(auVar124,auVar115);
        auVar114 = vmulps_avx512vl(auVar114,auVar114);
        uVar187 = vcmpps_avx512vl(auVar114,auVar124,2);
        bVar101 = (byte)uVar30 & (byte)uVar187;
        if (bVar101 != 0) {
          auVar126 = vmulps_avx512vl(local_4e0,auVar126);
          auVar127 = vfmadd213ps_avx512vl(auVar127,local_4c0,auVar126);
          auVar118 = vfmadd213ps_avx512vl(auVar118,local_4a0,auVar127);
          auVar120 = vfmadd213ps_avx512vl(auVar120,local_7e0,auVar118);
          auVar128 = vmulps_avx512vl(local_4e0,auVar128);
          auVar129 = vfmadd213ps_avx512vl(auVar129,local_4c0,auVar128);
          auVar117 = vfmadd213ps_avx512vl(auVar117,local_4a0,auVar129);
          auVar118 = vfmadd213ps_avx512vl(auVar119,local_7e0,auVar117);
          auVar119 = *(undefined1 (*) [32])(lVar31 + 0x21afd38 + lVar97 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar31 + 0x21b01bc + lVar97 * 4);
          auVar129 = *(undefined1 (*) [32])(lVar31 + 0x21b0640 + lVar97 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar31 + 0x21b0ac4 + lVar97 * 4);
          auVar127 = vmulps_avx512vl(_local_6e0,auVar128);
          auVar126 = vmulps_avx512vl(_local_700,auVar128);
          auVar128 = vmulps_avx512vl(local_4e0,auVar128);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar129,local_6a0);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar129,local_6c0);
          auVar129 = vfmadd231ps_avx512vl(auVar128,local_4c0,auVar129);
          auVar128 = vfmadd231ps_avx512vl(auVar127,auVar117,local_660);
          auVar127 = vfmadd231ps_avx512vl(auVar126,auVar117,local_680);
          auVar117 = vfmadd231ps_avx512vl(auVar129,local_4a0,auVar117);
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar119,local_620);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar119,local_640);
          auVar106 = vfmadd231ps_fma(auVar117,auVar119,local_7e0);
          auVar119 = *(undefined1 (*) [32])(lVar31 + 0x21b2158 + lVar97 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar31 + 0x21b2a60 + lVar97 * 4);
          auVar129 = *(undefined1 (*) [32])(lVar31 + 0x21b2ee4 + lVar97 * 4);
          auVar126 = vmulps_avx512vl(_local_6e0,auVar129);
          auVar124 = vmulps_avx512vl(_local_700,auVar129);
          auVar129 = vmulps_avx512vl(local_4e0,auVar129);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar117,local_6a0);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar117,local_6c0);
          auVar129 = vfmadd231ps_avx512vl(auVar129,local_4c0,auVar117);
          auVar117 = *(undefined1 (*) [32])(lVar31 + 0x21b25dc + lVar97 * 4);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar117,local_660);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar117,local_680);
          auVar117 = vfmadd231ps_avx512vl(auVar129,local_4a0,auVar117);
          auVar129 = vfmadd231ps_avx512vl(auVar126,auVar119,local_620);
          auVar126 = vfmadd231ps_avx512vl(auVar124,auVar119,local_640);
          auVar117 = vfmadd231ps_avx512vl(auVar117,local_7e0,auVar119);
          auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar128,auVar124);
          vandps_avx512vl(auVar127,auVar124);
          auVar119 = vmaxps_avx(auVar124,auVar124);
          vandps_avx512vl(ZEXT1632(auVar106),auVar124);
          auVar119 = vmaxps_avx(auVar119,auVar124);
          auVar91._4_4_ = uStack_79c;
          auVar91._0_4_ = local_7a0;
          auVar91._8_4_ = uStack_798;
          auVar91._12_4_ = uStack_794;
          auVar91._16_4_ = uStack_790;
          auVar91._20_4_ = uStack_78c;
          auVar91._24_4_ = uStack_788;
          auVar91._28_4_ = uStack_784;
          uVar93 = vcmpps_avx512vl(auVar119,auVar91,1);
          bVar14 = (bool)((byte)uVar93 & 1);
          auVar143._0_4_ = (float)((uint)bVar14 * auVar121._0_4_ | (uint)!bVar14 * auVar128._0_4_);
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar128._4_4_);
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar128._8_4_);
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar143._12_4_ =
               (float)((uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar128._12_4_);
          bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar143._16_4_ =
               (float)((uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * auVar128._16_4_);
          bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar143._20_4_ =
               (float)((uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * auVar128._20_4_);
          bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar143._24_4_ =
               (float)((uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * auVar128._24_4_);
          bVar14 = SUB81(uVar93 >> 7,0);
          auVar143._28_4_ = (uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * auVar128._28_4_;
          bVar14 = (bool)((byte)uVar93 & 1);
          auVar144._0_4_ = (float)((uint)bVar14 * auVar122._0_4_ | (uint)!bVar14 * auVar127._0_4_);
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar144._4_4_ = (float)((uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar127._4_4_);
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar144._8_4_ = (float)((uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar127._8_4_);
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar144._12_4_ =
               (float)((uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar127._12_4_);
          bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar144._16_4_ =
               (float)((uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar127._16_4_);
          bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar144._20_4_ =
               (float)((uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar127._20_4_);
          bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar144._24_4_ =
               (float)((uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar127._24_4_);
          bVar14 = SUB81(uVar93 >> 7,0);
          auVar144._28_4_ = (uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar127._28_4_;
          vandps_avx512vl(auVar129,auVar124);
          vandps_avx512vl(auVar126,auVar124);
          auVar119 = vmaxps_avx(auVar144,auVar144);
          vandps_avx512vl(auVar117,auVar124);
          auVar119 = vmaxps_avx(auVar119,auVar144);
          uVar93 = vcmpps_avx512vl(auVar119,auVar91,1);
          bVar14 = (bool)((byte)uVar93 & 1);
          auVar145._0_4_ = (uint)bVar14 * auVar121._0_4_ | (uint)!bVar14 * auVar129._0_4_;
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar129._4_4_;
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar129._8_4_;
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar129._12_4_;
          bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar145._16_4_ = (uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * auVar129._16_4_;
          bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar145._20_4_ = (uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * auVar129._20_4_;
          bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar145._24_4_ = (uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * auVar129._24_4_;
          bVar14 = SUB81(uVar93 >> 7,0);
          auVar145._28_4_ = (uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * auVar129._28_4_;
          bVar14 = (bool)((byte)uVar93 & 1);
          auVar146._0_4_ = (float)((uint)bVar14 * auVar122._0_4_ | (uint)!bVar14 * auVar126._0_4_);
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar146._4_4_ = (float)((uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar126._4_4_);
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar146._8_4_ = (float)((uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar126._8_4_);
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar146._12_4_ =
               (float)((uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar126._12_4_);
          bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar146._16_4_ =
               (float)((uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar126._16_4_);
          bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar146._20_4_ =
               (float)((uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar126._20_4_);
          bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar146._24_4_ =
               (float)((uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar126._24_4_);
          bVar14 = SUB81(uVar93 >> 7,0);
          auVar146._28_4_ = (uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar126._28_4_;
          auVar228._8_4_ = 0x80000000;
          auVar228._0_8_ = 0x8000000080000000;
          auVar228._12_4_ = 0x80000000;
          auVar228._16_4_ = 0x80000000;
          auVar228._20_4_ = 0x80000000;
          auVar228._24_4_ = 0x80000000;
          auVar228._28_4_ = 0x80000000;
          auVar119 = vxorps_avx512vl(auVar145,auVar228);
          auVar112 = vxorps_avx512vl(auVar124._0_16_,auVar124._0_16_);
          auVar117 = vfmadd213ps_avx512vl(auVar143,auVar143,ZEXT1632(auVar112));
          auVar106 = vfmadd231ps_fma(auVar117,auVar144,auVar144);
          auVar117 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
          auVar237._8_4_ = 0xbf000000;
          auVar237._0_8_ = 0xbf000000bf000000;
          auVar237._12_4_ = 0xbf000000;
          auVar237._16_4_ = 0xbf000000;
          auVar237._20_4_ = 0xbf000000;
          auVar237._24_4_ = 0xbf000000;
          auVar237._28_4_ = 0xbf000000;
          fVar190 = auVar117._0_4_;
          fVar184 = auVar117._4_4_;
          fVar185 = auVar117._8_4_;
          fVar186 = auVar117._12_4_;
          fVar200 = auVar117._16_4_;
          fVar207 = auVar117._20_4_;
          fVar103 = auVar117._24_4_;
          auVar61._4_4_ = fVar184 * fVar184 * fVar184 * auVar106._4_4_ * -0.5;
          auVar61._0_4_ = fVar190 * fVar190 * fVar190 * auVar106._0_4_ * -0.5;
          auVar61._8_4_ = fVar185 * fVar185 * fVar185 * auVar106._8_4_ * -0.5;
          auVar61._12_4_ = fVar186 * fVar186 * fVar186 * auVar106._12_4_ * -0.5;
          auVar61._16_4_ = fVar200 * fVar200 * fVar200 * -0.0;
          auVar61._20_4_ = fVar207 * fVar207 * fVar207 * -0.0;
          auVar61._24_4_ = fVar103 * fVar103 * fVar103 * -0.0;
          auVar61._28_4_ = auVar144._28_4_;
          auVar129 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar117 = vfmadd231ps_avx512vl(auVar61,auVar129,auVar117);
          auVar62._4_4_ = auVar144._4_4_ * auVar117._4_4_;
          auVar62._0_4_ = auVar144._0_4_ * auVar117._0_4_;
          auVar62._8_4_ = auVar144._8_4_ * auVar117._8_4_;
          auVar62._12_4_ = auVar144._12_4_ * auVar117._12_4_;
          auVar62._16_4_ = auVar144._16_4_ * auVar117._16_4_;
          auVar62._20_4_ = auVar144._20_4_ * auVar117._20_4_;
          auVar62._24_4_ = auVar144._24_4_ * auVar117._24_4_;
          auVar62._28_4_ = 0;
          auVar63._4_4_ = auVar117._4_4_ * -auVar143._4_4_;
          auVar63._0_4_ = auVar117._0_4_ * -auVar143._0_4_;
          auVar63._8_4_ = auVar117._8_4_ * -auVar143._8_4_;
          auVar63._12_4_ = auVar117._12_4_ * -auVar143._12_4_;
          auVar63._16_4_ = auVar117._16_4_ * -auVar143._16_4_;
          auVar63._20_4_ = auVar117._20_4_ * -auVar143._20_4_;
          auVar63._24_4_ = auVar117._24_4_ * -auVar143._24_4_;
          auVar63._28_4_ = auVar144._28_4_;
          auVar128 = vmulps_avx512vl(auVar117,ZEXT1632(auVar112));
          auVar126 = ZEXT1632(auVar112);
          auVar117 = vfmadd213ps_avx512vl(auVar145,auVar145,auVar126);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar146,auVar146);
          auVar127 = vrsqrt14ps_avx512vl(auVar117);
          auVar117 = vmulps_avx512vl(auVar117,auVar237);
          fVar190 = auVar127._0_4_;
          fVar184 = auVar127._4_4_;
          fVar185 = auVar127._8_4_;
          fVar186 = auVar127._12_4_;
          fVar200 = auVar127._16_4_;
          fVar207 = auVar127._20_4_;
          fVar103 = auVar127._24_4_;
          auVar64._4_4_ = fVar184 * fVar184 * fVar184 * auVar117._4_4_;
          auVar64._0_4_ = fVar190 * fVar190 * fVar190 * auVar117._0_4_;
          auVar64._8_4_ = fVar185 * fVar185 * fVar185 * auVar117._8_4_;
          auVar64._12_4_ = fVar186 * fVar186 * fVar186 * auVar117._12_4_;
          auVar64._16_4_ = fVar200 * fVar200 * fVar200 * auVar117._16_4_;
          auVar64._20_4_ = fVar207 * fVar207 * fVar207 * auVar117._20_4_;
          auVar64._24_4_ = fVar103 * fVar103 * fVar103 * auVar117._24_4_;
          auVar64._28_4_ = auVar117._28_4_;
          auVar117 = vfmadd231ps_avx512vl(auVar64,auVar129,auVar127);
          auVar65._4_4_ = auVar146._4_4_ * auVar117._4_4_;
          auVar65._0_4_ = auVar146._0_4_ * auVar117._0_4_;
          auVar65._8_4_ = auVar146._8_4_ * auVar117._8_4_;
          auVar65._12_4_ = auVar146._12_4_ * auVar117._12_4_;
          auVar65._16_4_ = auVar146._16_4_ * auVar117._16_4_;
          auVar65._20_4_ = auVar146._20_4_ * auVar117._20_4_;
          auVar65._24_4_ = auVar146._24_4_ * auVar117._24_4_;
          auVar65._28_4_ = auVar127._28_4_;
          auVar66._4_4_ = auVar117._4_4_ * auVar119._4_4_;
          auVar66._0_4_ = auVar117._0_4_ * auVar119._0_4_;
          auVar66._8_4_ = auVar117._8_4_ * auVar119._8_4_;
          auVar66._12_4_ = auVar117._12_4_ * auVar119._12_4_;
          auVar66._16_4_ = auVar117._16_4_ * auVar119._16_4_;
          auVar66._20_4_ = auVar117._20_4_ * auVar119._20_4_;
          auVar66._24_4_ = auVar117._24_4_ * auVar119._24_4_;
          auVar66._28_4_ = auVar119._28_4_;
          auVar119 = vmulps_avx512vl(auVar117,auVar126);
          auVar106 = vfmadd213ps_fma(auVar62,auVar116,ZEXT1632(auVar113));
          auVar7 = vfmadd213ps_fma(auVar63,auVar116,ZEXT1632(auVar108));
          auVar129 = vfmadd213ps_avx512vl(auVar128,auVar116,auVar118);
          auVar127 = vfmadd213ps_avx512vl(auVar65,auVar123,ZEXT1632(auVar109));
          auVar192 = vfnmadd213ps_fma(auVar62,auVar116,ZEXT1632(auVar113));
          auVar113 = vfmadd213ps_fma(auVar66,auVar123,ZEXT1632(auVar107));
          auVar202 = vfnmadd213ps_fma(auVar63,auVar116,ZEXT1632(auVar108));
          auVar108 = vfmadd213ps_fma(auVar119,auVar123,auVar120);
          auVar226 = vfnmadd231ps_fma(auVar118,auVar116,auVar128);
          auVar203 = vfnmadd213ps_fma(auVar65,auVar123,ZEXT1632(auVar109));
          auVar110 = vfnmadd213ps_fma(auVar66,auVar123,ZEXT1632(auVar107));
          auVar111 = vfnmadd231ps_fma(auVar120,auVar123,auVar119);
          auVar120 = vsubps_avx512vl(auVar127,ZEXT1632(auVar192));
          auVar119 = vsubps_avx(ZEXT1632(auVar113),ZEXT1632(auVar202));
          auVar117 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar226));
          auVar67._4_4_ = auVar119._4_4_ * auVar226._4_4_;
          auVar67._0_4_ = auVar119._0_4_ * auVar226._0_4_;
          auVar67._8_4_ = auVar119._8_4_ * auVar226._8_4_;
          auVar67._12_4_ = auVar119._12_4_ * auVar226._12_4_;
          auVar67._16_4_ = auVar119._16_4_ * 0.0;
          auVar67._20_4_ = auVar119._20_4_ * 0.0;
          auVar67._24_4_ = auVar119._24_4_ * 0.0;
          auVar67._28_4_ = auVar128._28_4_;
          auVar109 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar202),auVar117);
          auVar68._4_4_ = auVar117._4_4_ * auVar192._4_4_;
          auVar68._0_4_ = auVar117._0_4_ * auVar192._0_4_;
          auVar68._8_4_ = auVar117._8_4_ * auVar192._8_4_;
          auVar68._12_4_ = auVar117._12_4_ * auVar192._12_4_;
          auVar68._16_4_ = auVar117._16_4_ * 0.0;
          auVar68._20_4_ = auVar117._20_4_ * 0.0;
          auVar68._24_4_ = auVar117._24_4_ * 0.0;
          auVar68._28_4_ = auVar117._28_4_;
          auVar107 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar226),auVar120);
          auVar69._4_4_ = auVar202._4_4_ * auVar120._4_4_;
          auVar69._0_4_ = auVar202._0_4_ * auVar120._0_4_;
          auVar69._8_4_ = auVar202._8_4_ * auVar120._8_4_;
          auVar69._12_4_ = auVar202._12_4_ * auVar120._12_4_;
          auVar69._16_4_ = auVar120._16_4_ * 0.0;
          auVar69._20_4_ = auVar120._20_4_ * 0.0;
          auVar69._24_4_ = auVar120._24_4_ * 0.0;
          auVar69._28_4_ = auVar120._28_4_;
          auVar191 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar192),auVar119);
          auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar191),auVar126,ZEXT1632(auVar107));
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar126,ZEXT1632(auVar109));
          auVar114 = ZEXT1632(auVar112);
          uVar93 = vcmpps_avx512vl(auVar119,auVar114,2);
          bVar92 = (byte)uVar93;
          fVar158 = (float)((uint)(bVar92 & 1) * auVar106._0_4_ |
                           (uint)!(bool)(bVar92 & 1) * auVar203._0_4_);
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          fVar160 = (float)((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar203._4_4_);
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          fVar163 = (float)((uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar203._8_4_);
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          fVar164 = (float)((uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar203._12_4_);
          auVar126 = ZEXT1632(CONCAT412(fVar164,CONCAT48(fVar163,CONCAT44(fVar160,fVar158))));
          fVar159 = (float)((uint)(bVar92 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar92 & 1) * auVar110._0_4_);
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          fVar162 = (float)((uint)bVar14 * auVar7._4_4_ | (uint)!bVar14 * auVar110._4_4_);
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          fVar161 = (float)((uint)bVar14 * auVar7._8_4_ | (uint)!bVar14 * auVar110._8_4_);
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          fVar165 = (float)((uint)bVar14 * auVar7._12_4_ | (uint)!bVar14 * auVar110._12_4_);
          auVar121 = ZEXT1632(CONCAT412(fVar165,CONCAT48(fVar161,CONCAT44(fVar162,fVar159))));
          auVar147._0_4_ =
               (float)((uint)(bVar92 & 1) * auVar129._0_4_ |
                      (uint)!(bool)(bVar92 & 1) * auVar111._0_4_);
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar147._4_4_ = (float)((uint)bVar14 * auVar129._4_4_ | (uint)!bVar14 * auVar111._4_4_);
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar147._8_4_ = (float)((uint)bVar14 * auVar129._8_4_ | (uint)!bVar14 * auVar111._8_4_);
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar147._12_4_ =
               (float)((uint)bVar14 * auVar129._12_4_ | (uint)!bVar14 * auVar111._12_4_);
          fVar190 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar129._16_4_);
          auVar147._16_4_ = fVar190;
          fVar184 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar129._20_4_);
          auVar147._20_4_ = fVar184;
          fVar185 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar129._24_4_);
          auVar147._24_4_ = fVar185;
          iVar1 = (uint)(byte)(uVar93 >> 7) * auVar129._28_4_;
          auVar147._28_4_ = iVar1;
          auVar119 = vblendmps_avx512vl(ZEXT1632(auVar192),auVar127);
          auVar148._0_4_ =
               (uint)(bVar92 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar109._0_4_;
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar148._4_4_ = (uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar109._4_4_;
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar148._8_4_ = (uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar109._8_4_;
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar148._12_4_ = (uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar109._12_4_;
          auVar148._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * auVar119._16_4_;
          auVar148._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * auVar119._20_4_;
          auVar148._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * auVar119._24_4_;
          auVar148._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar119._28_4_;
          auVar119 = vblendmps_avx512vl(ZEXT1632(auVar202),ZEXT1632(auVar113));
          auVar149._0_4_ =
               (float)((uint)(bVar92 & 1) * auVar119._0_4_ |
                      (uint)!(bool)(bVar92 & 1) * auVar106._0_4_);
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar149._4_4_ = (float)((uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar106._4_4_);
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar149._8_4_ = (float)((uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar106._8_4_);
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar149._12_4_ =
               (float)((uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar106._12_4_);
          fVar186 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar119._16_4_);
          auVar149._16_4_ = fVar186;
          fVar200 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar119._20_4_);
          auVar149._20_4_ = fVar200;
          fVar207 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar119._24_4_);
          auVar149._24_4_ = fVar207;
          auVar149._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar119._28_4_;
          auVar119 = vblendmps_avx512vl(ZEXT1632(auVar226),ZEXT1632(auVar108));
          auVar150._0_4_ =
               (float)((uint)(bVar92 & 1) * auVar119._0_4_ |
                      (uint)!(bool)(bVar92 & 1) * auVar7._0_4_);
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar150._4_4_ = (float)((uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar7._4_4_);
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar150._8_4_ = (float)((uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar7._8_4_);
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar150._12_4_ = (float)((uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar7._12_4_);
          fVar103 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar119._16_4_);
          auVar150._16_4_ = fVar103;
          fVar104 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar119._20_4_);
          auVar150._20_4_ = fVar104;
          fVar157 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar119._24_4_);
          auVar150._24_4_ = fVar157;
          iVar2 = (uint)(byte)(uVar93 >> 7) * auVar119._28_4_;
          auVar150._28_4_ = iVar2;
          auVar151._0_4_ =
               (uint)(bVar92 & 1) * (int)auVar192._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar127._0_4_
          ;
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar14 * (int)auVar192._4_4_ | (uint)!bVar14 * auVar127._4_4_;
          bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar14 * (int)auVar192._8_4_ | (uint)!bVar14 * auVar127._8_4_;
          bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar151._12_4_ = (uint)bVar14 * (int)auVar192._12_4_ | (uint)!bVar14 * auVar127._12_4_;
          auVar151._16_4_ = (uint)!(bool)((byte)(uVar93 >> 4) & 1) * auVar127._16_4_;
          auVar151._20_4_ = (uint)!(bool)((byte)(uVar93 >> 5) & 1) * auVar127._20_4_;
          auVar151._24_4_ = (uint)!(bool)((byte)(uVar93 >> 6) & 1) * auVar127._24_4_;
          auVar151._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar127._28_4_;
          bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar93 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar93 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar93 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar127 = vsubps_avx512vl(auVar151,auVar126);
          auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar202._12_4_ |
                                                   (uint)!bVar18 * auVar113._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar202._8_4_ |
                                                            (uint)!bVar16 * auVar113._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar202._4_4_ |
                                                                     (uint)!bVar14 * auVar113._4_4_,
                                                                     (uint)(bVar92 & 1) *
                                                                     (int)auVar202._0_4_ |
                                                                     (uint)!(bool)(bVar92 & 1) *
                                                                     auVar113._0_4_)))),auVar121);
          auVar221 = ZEXT3264(auVar117);
          auVar129 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar226._12_4_ |
                                                   (uint)!bVar19 * auVar108._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar226._8_4_ |
                                                            (uint)!bVar17 * auVar108._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar226._4_4_ |
                                                                     (uint)!bVar15 * auVar108._4_4_,
                                                                     (uint)(bVar92 & 1) *
                                                                     (int)auVar226._0_4_ |
                                                                     (uint)!(bool)(bVar92 & 1) *
                                                                     auVar108._0_4_)))),auVar147);
          auVar128 = vsubps_avx(auVar126,auVar148);
          auVar225 = ZEXT3264(auVar128);
          auVar120 = vsubps_avx(auVar121,auVar149);
          auVar118 = vsubps_avx(auVar147,auVar150);
          auVar70._4_4_ = auVar129._4_4_ * fVar160;
          auVar70._0_4_ = auVar129._0_4_ * fVar158;
          auVar70._8_4_ = auVar129._8_4_ * fVar163;
          auVar70._12_4_ = auVar129._12_4_ * fVar164;
          auVar70._16_4_ = auVar129._16_4_ * 0.0;
          auVar70._20_4_ = auVar129._20_4_ * 0.0;
          auVar70._24_4_ = auVar129._24_4_ * 0.0;
          auVar70._28_4_ = 0;
          auVar113 = vfmsub231ps_fma(auVar70,auVar147,auVar127);
          auVar205._0_4_ = fVar159 * auVar127._0_4_;
          auVar205._4_4_ = fVar162 * auVar127._4_4_;
          auVar205._8_4_ = fVar161 * auVar127._8_4_;
          auVar205._12_4_ = fVar165 * auVar127._12_4_;
          auVar205._16_4_ = auVar127._16_4_ * 0.0;
          auVar205._20_4_ = auVar127._20_4_ * 0.0;
          auVar205._24_4_ = auVar127._24_4_ * 0.0;
          auVar205._28_4_ = 0;
          auVar108 = vfmsub231ps_fma(auVar205,auVar126,auVar117);
          auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),auVar114,ZEXT1632(auVar113));
          auVar216._0_4_ = auVar117._0_4_ * auVar147._0_4_;
          auVar216._4_4_ = auVar117._4_4_ * auVar147._4_4_;
          auVar216._8_4_ = auVar117._8_4_ * auVar147._8_4_;
          auVar216._12_4_ = auVar117._12_4_ * auVar147._12_4_;
          auVar216._16_4_ = auVar117._16_4_ * fVar190;
          auVar216._20_4_ = auVar117._20_4_ * fVar184;
          auVar216._24_4_ = auVar117._24_4_ * fVar185;
          auVar216._28_4_ = 0;
          auVar113 = vfmsub231ps_fma(auVar216,auVar121,auVar129);
          auVar122 = vfmadd231ps_avx512vl(auVar119,auVar114,ZEXT1632(auVar113));
          auVar119 = vmulps_avx512vl(auVar118,auVar148);
          auVar119 = vfmsub231ps_avx512vl(auVar119,auVar128,auVar150);
          auVar71._4_4_ = auVar120._4_4_ * auVar150._4_4_;
          auVar71._0_4_ = auVar120._0_4_ * auVar150._0_4_;
          auVar71._8_4_ = auVar120._8_4_ * auVar150._8_4_;
          auVar71._12_4_ = auVar120._12_4_ * auVar150._12_4_;
          auVar71._16_4_ = auVar120._16_4_ * fVar103;
          auVar71._20_4_ = auVar120._20_4_ * fVar104;
          auVar71._24_4_ = auVar120._24_4_ * fVar157;
          auVar71._28_4_ = iVar2;
          auVar113 = vfmsub231ps_fma(auVar71,auVar149,auVar118);
          auVar217._0_4_ = auVar149._0_4_ * auVar128._0_4_;
          auVar217._4_4_ = auVar149._4_4_ * auVar128._4_4_;
          auVar217._8_4_ = auVar149._8_4_ * auVar128._8_4_;
          auVar217._12_4_ = auVar149._12_4_ * auVar128._12_4_;
          auVar217._16_4_ = fVar186 * auVar128._16_4_;
          auVar217._20_4_ = fVar200 * auVar128._20_4_;
          auVar217._24_4_ = fVar207 * auVar128._24_4_;
          auVar217._28_4_ = 0;
          auVar108 = vfmsub231ps_fma(auVar217,auVar120,auVar148);
          auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),auVar114,auVar119);
          auVar124 = vfmadd231ps_avx512vl(auVar119,auVar114,ZEXT1632(auVar113));
          auVar218 = ZEXT3264(auVar124);
          auVar119 = vmaxps_avx(auVar122,auVar124);
          uVar187 = vcmpps_avx512vl(auVar119,auVar114,2);
          bVar101 = bVar101 & (byte)uVar187;
          if (bVar101 != 0) {
            uVar167 = *(undefined4 *)(ray + sVar100 * 4 + 0x200);
            auVar238._4_4_ = uVar167;
            auVar238._0_4_ = uVar167;
            auVar238._8_4_ = uVar167;
            auVar238._12_4_ = uVar167;
            auVar238._16_4_ = uVar167;
            auVar238._20_4_ = uVar167;
            auVar238._24_4_ = uVar167;
            auVar238._28_4_ = uVar167;
            auVar239 = ZEXT3264(auVar238);
            auVar72._4_4_ = auVar118._4_4_ * auVar117._4_4_;
            auVar72._0_4_ = auVar118._0_4_ * auVar117._0_4_;
            auVar72._8_4_ = auVar118._8_4_ * auVar117._8_4_;
            auVar72._12_4_ = auVar118._12_4_ * auVar117._12_4_;
            auVar72._16_4_ = auVar118._16_4_ * auVar117._16_4_;
            auVar72._20_4_ = auVar118._20_4_ * auVar117._20_4_;
            auVar72._24_4_ = auVar118._24_4_ * auVar117._24_4_;
            auVar72._28_4_ = auVar119._28_4_;
            auVar107 = vfmsub231ps_fma(auVar72,auVar120,auVar129);
            auVar73._4_4_ = auVar129._4_4_ * auVar128._4_4_;
            auVar73._0_4_ = auVar129._0_4_ * auVar128._0_4_;
            auVar73._8_4_ = auVar129._8_4_ * auVar128._8_4_;
            auVar73._12_4_ = auVar129._12_4_ * auVar128._12_4_;
            auVar73._16_4_ = auVar129._16_4_ * auVar128._16_4_;
            auVar73._20_4_ = auVar129._20_4_ * auVar128._20_4_;
            auVar73._24_4_ = auVar129._24_4_ * auVar128._24_4_;
            auVar73._28_4_ = auVar129._28_4_;
            auVar109 = vfmsub231ps_fma(auVar73,auVar127,auVar118);
            auVar74._4_4_ = auVar120._4_4_ * auVar127._4_4_;
            auVar74._0_4_ = auVar120._0_4_ * auVar127._0_4_;
            auVar74._8_4_ = auVar120._8_4_ * auVar127._8_4_;
            auVar74._12_4_ = auVar120._12_4_ * auVar127._12_4_;
            auVar74._16_4_ = auVar120._16_4_ * auVar127._16_4_;
            auVar74._20_4_ = auVar120._20_4_ * auVar127._20_4_;
            auVar74._24_4_ = auVar120._24_4_ * auVar127._24_4_;
            auVar74._28_4_ = auVar120._28_4_;
            auVar106 = vfmsub231ps_fma(auVar74,auVar128,auVar117);
            auVar113 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar109),ZEXT1632(auVar106));
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT1632(auVar107),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar119 = vrcp14ps_avx512vl(ZEXT1632(auVar108));
            auVar225 = ZEXT3264(auVar119);
            auVar40._8_4_ = 0x3f800000;
            auVar40._0_8_ = 0x3f8000003f800000;
            auVar40._12_4_ = 0x3f800000;
            auVar40._16_4_ = 0x3f800000;
            auVar40._20_4_ = 0x3f800000;
            auVar40._24_4_ = 0x3f800000;
            auVar40._28_4_ = 0x3f800000;
            auVar117 = vfnmadd213ps_avx512vl(auVar119,ZEXT1632(auVar108),auVar40);
            auVar113 = vfmadd132ps_fma(auVar117,auVar119,auVar119);
            auVar221 = ZEXT1664(auVar113);
            auVar75._4_4_ = auVar106._4_4_ * auVar147._4_4_;
            auVar75._0_4_ = auVar106._0_4_ * auVar147._0_4_;
            auVar75._8_4_ = auVar106._8_4_ * auVar147._8_4_;
            auVar75._12_4_ = auVar106._12_4_ * auVar147._12_4_;
            auVar75._16_4_ = fVar190 * 0.0;
            auVar75._20_4_ = fVar184 * 0.0;
            auVar75._24_4_ = fVar185 * 0.0;
            auVar75._28_4_ = iVar1;
            auVar109 = vfmadd231ps_fma(auVar75,auVar121,ZEXT1632(auVar109));
            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar126,ZEXT1632(auVar107));
            fVar190 = auVar113._0_4_;
            fVar184 = auVar113._4_4_;
            fVar185 = auVar113._8_4_;
            fVar186 = auVar113._12_4_;
            local_7c0 = ZEXT1632(CONCAT412(auVar109._12_4_ * fVar186,
                                           CONCAT48(auVar109._8_4_ * fVar185,
                                                    CONCAT44(auVar109._4_4_ * fVar184,
                                                             auVar109._0_4_ * fVar190))));
            auVar240 = ZEXT3264(local_7c0);
            uVar187 = vcmpps_avx512vl(local_7c0,auVar238,2);
            uVar30 = vcmpps_avx512vl(local_7c0,local_760,0xd);
            bVar101 = (byte)uVar187 & (byte)uVar30 & bVar101;
            if (bVar101 != 0) {
              uVar102 = vcmpps_avx512vl(ZEXT1632(auVar108),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar102 = bVar101 & uVar102;
              if ((char)uVar102 != '\0') {
                fVar200 = auVar122._0_4_ * fVar190;
                fVar207 = auVar122._4_4_ * fVar184;
                auVar76._4_4_ = fVar207;
                auVar76._0_4_ = fVar200;
                fVar103 = auVar122._8_4_ * fVar185;
                auVar76._8_4_ = fVar103;
                fVar104 = auVar122._12_4_ * fVar186;
                auVar76._12_4_ = fVar104;
                fVar157 = auVar122._16_4_ * 0.0;
                auVar76._16_4_ = fVar157;
                fVar158 = auVar122._20_4_ * 0.0;
                auVar76._20_4_ = fVar158;
                fVar159 = auVar122._24_4_ * 0.0;
                auVar76._24_4_ = fVar159;
                auVar76._28_4_ = auVar122._28_4_;
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = 0x3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar199._16_4_ = 0x3f800000;
                auVar199._20_4_ = 0x3f800000;
                auVar199._24_4_ = 0x3f800000;
                auVar199._28_4_ = 0x3f800000;
                auVar119 = vsubps_avx(auVar199,auVar76);
                local_600._0_4_ =
                     (float)((uint)(bVar92 & 1) * (int)fVar200 |
                            (uint)!(bool)(bVar92 & 1) * auVar119._0_4_);
                bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
                local_600._4_4_ =
                     (float)((uint)bVar14 * (int)fVar207 | (uint)!bVar14 * auVar119._4_4_);
                bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
                local_600._8_4_ =
                     (float)((uint)bVar14 * (int)fVar103 | (uint)!bVar14 * auVar119._8_4_);
                bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
                local_600._12_4_ =
                     (float)((uint)bVar14 * (int)fVar104 | (uint)!bVar14 * auVar119._12_4_);
                bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
                local_600._16_4_ =
                     (float)((uint)bVar14 * (int)fVar157 | (uint)!bVar14 * auVar119._16_4_);
                bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
                local_600._20_4_ =
                     (float)((uint)bVar14 * (int)fVar158 | (uint)!bVar14 * auVar119._20_4_);
                bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
                local_600._24_4_ =
                     (float)((uint)bVar14 * (int)fVar159 | (uint)!bVar14 * auVar119._24_4_);
                bVar14 = SUB81(uVar93 >> 7,0);
                local_600._28_4_ =
                     (float)((uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar119._28_4_);
                auVar119 = vsubps_avx(auVar123,auVar116);
                auVar113 = vfmadd213ps_fma(auVar119,local_600,auVar116);
                uVar167 = *(undefined4 *)((long)pre->ray_space + sVar100 * 4 + -0x40);
                auVar41._4_4_ = uVar167;
                auVar41._0_4_ = uVar167;
                auVar41._8_4_ = uVar167;
                auVar41._12_4_ = uVar167;
                auVar41._16_4_ = uVar167;
                auVar41._20_4_ = uVar167;
                auVar41._24_4_ = uVar167;
                auVar41._28_4_ = uVar167;
                auVar119 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar113._12_4_ + auVar113._12_4_,
                                                              CONCAT48(auVar113._8_4_ +
                                                                       auVar113._8_4_,
                                                                       CONCAT44(auVar113._4_4_ +
                                                                                auVar113._4_4_,
                                                                                auVar113._0_4_ +
                                                                                auVar113._0_4_)))),
                                           auVar41);
                uVar96 = vcmpps_avx512vl(local_7c0,auVar119,6);
                uVar102 = uVar102 & uVar96;
                bVar101 = (byte)uVar102;
                if (bVar101 != 0) {
                  auVar189._0_4_ = auVar124._0_4_ * fVar190;
                  auVar189._4_4_ = auVar124._4_4_ * fVar184;
                  auVar189._8_4_ = auVar124._8_4_ * fVar185;
                  auVar189._12_4_ = auVar124._12_4_ * fVar186;
                  auVar189._16_4_ = auVar124._16_4_ * 0.0;
                  auVar189._20_4_ = auVar124._20_4_ * 0.0;
                  auVar189._24_4_ = auVar124._24_4_ * 0.0;
                  auVar189._28_4_ = 0;
                  auVar206._8_4_ = 0x3f800000;
                  auVar206._0_8_ = 0x3f8000003f800000;
                  auVar206._12_4_ = 0x3f800000;
                  auVar206._16_4_ = 0x3f800000;
                  auVar206._20_4_ = 0x3f800000;
                  auVar206._24_4_ = 0x3f800000;
                  auVar206._28_4_ = 0x3f800000;
                  auVar119 = vsubps_avx(auVar206,auVar189);
                  auVar152._0_4_ =
                       (uint)(bVar92 & 1) * (int)auVar189._0_4_ |
                       (uint)!(bool)(bVar92 & 1) * auVar119._0_4_;
                  bVar14 = (bool)((byte)(uVar93 >> 1) & 1);
                  auVar152._4_4_ =
                       (uint)bVar14 * (int)auVar189._4_4_ | (uint)!bVar14 * auVar119._4_4_;
                  bVar14 = (bool)((byte)(uVar93 >> 2) & 1);
                  auVar152._8_4_ =
                       (uint)bVar14 * (int)auVar189._8_4_ | (uint)!bVar14 * auVar119._8_4_;
                  bVar14 = (bool)((byte)(uVar93 >> 3) & 1);
                  auVar152._12_4_ =
                       (uint)bVar14 * (int)auVar189._12_4_ | (uint)!bVar14 * auVar119._12_4_;
                  bVar14 = (bool)((byte)(uVar93 >> 4) & 1);
                  auVar152._16_4_ =
                       (uint)bVar14 * (int)auVar189._16_4_ | (uint)!bVar14 * auVar119._16_4_;
                  bVar14 = (bool)((byte)(uVar93 >> 5) & 1);
                  auVar152._20_4_ =
                       (uint)bVar14 * (int)auVar189._20_4_ | (uint)!bVar14 * auVar119._20_4_;
                  bVar14 = (bool)((byte)(uVar93 >> 6) & 1);
                  auVar152._24_4_ =
                       (uint)bVar14 * (int)auVar189._24_4_ | (uint)!bVar14 * auVar119._24_4_;
                  auVar152._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar119._28_4_;
                  auVar42._8_4_ = 0x40000000;
                  auVar42._0_8_ = 0x4000000040000000;
                  auVar42._12_4_ = 0x40000000;
                  auVar42._16_4_ = 0x40000000;
                  auVar42._20_4_ = 0x40000000;
                  auVar42._24_4_ = 0x40000000;
                  auVar42._28_4_ = 0x40000000;
                  local_5e0 = vfmsub132ps_avx512vl(auVar152,auVar206,auVar42);
                  local_5a0 = (undefined4)lVar97;
                  local_580 = local_840;
                  uStack_578 = uStack_838;
                  local_570 = local_850;
                  uStack_568 = uStack_848;
                  local_560 = local_860;
                  uStack_558 = uStack_858;
                  pGVar11 = (context->scene->geometries).items[uVar98].ptr;
                  if ((pGVar11->mask & *(uint *)(ray + sVar100 * 4 + 0x240)) != 0) {
                    auVar113 = vcvtsi2ss_avx512f(auVar112,local_5a0);
                    fVar190 = auVar113._0_4_;
                    local_540[0] = (fVar190 + local_600._0_4_ + 0.0) * local_3c0;
                    local_540[1] = (fVar190 + local_600._4_4_ + 1.0) * fStack_3bc;
                    local_540[2] = (fVar190 + local_600._8_4_ + 2.0) * fStack_3b8;
                    local_540[3] = (fVar190 + local_600._12_4_ + 3.0) * fStack_3b4;
                    fStack_530 = (fVar190 + local_600._16_4_ + 4.0) * fStack_3b0;
                    fStack_52c = (fVar190 + local_600._20_4_ + 5.0) * fStack_3ac;
                    fStack_528 = (fVar190 + local_600._24_4_ + 6.0) * fStack_3a8;
                    fStack_524 = fVar190 + local_600._28_4_ + 7.0;
                    local_520 = local_5e0;
                    local_500 = local_7c0;
                    auVar176._8_4_ = 0x7f800000;
                    auVar176._0_8_ = 0x7f8000007f800000;
                    auVar176._12_4_ = 0x7f800000;
                    auVar176._16_4_ = 0x7f800000;
                    auVar176._20_4_ = 0x7f800000;
                    auVar176._24_4_ = 0x7f800000;
                    auVar176._28_4_ = 0x7f800000;
                    auVar119 = vblendmps_avx512vl(auVar176,local_7c0);
                    auVar153._0_4_ =
                         (uint)(bVar101 & 1) * auVar119._0_4_ |
                         (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
                    auVar153._4_4_ = (uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
                    auVar153._8_4_ = (uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
                    auVar153._12_4_ = (uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
                    auVar153._16_4_ = (uint)bVar14 * auVar119._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
                    auVar153._20_4_ = (uint)bVar14 * auVar119._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
                    auVar153._24_4_ = (uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = SUB81(uVar102 >> 7,0);
                    auVar153._28_4_ = (uint)bVar14 * auVar119._28_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar119 = vshufps_avx(auVar153,auVar153,0xb1);
                    auVar119 = vminps_avx(auVar153,auVar119);
                    auVar117 = vshufpd_avx(auVar119,auVar119,5);
                    auVar119 = vminps_avx(auVar119,auVar117);
                    auVar117 = vpermpd_avx2(auVar119,0x4e);
                    auVar119 = vminps_avx(auVar119,auVar117);
                    uVar187 = vcmpps_avx512vl(auVar153,auVar119,0);
                    uVar94 = (uint)uVar102;
                    if (((byte)uVar187 & bVar101) != 0) {
                      uVar94 = (uint)((byte)uVar187 & bVar101);
                    }
                    uVar95 = 0;
                    for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                      uVar95 = uVar95 + 1;
                    }
                    uVar93 = (ulong)uVar95;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_3e0 = vmovdqa64_avx512vl(auVar229._0_32_);
                      local_5c0 = local_7c0;
                      local_59c = iVar9;
                      local_590 = auVar105;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_540[uVar93]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_520 + uVar93 * 4)))
                        ;
                        *(undefined4 *)(ray + sVar100 * 4 + 0x200) =
                             *(undefined4 *)(local_500 + uVar93 * 4);
                        local_830.context = context->user;
                        fVar186 = local_200._0_4_;
                        fVar190 = 1.0 - fVar186;
                        auVar34._8_4_ = 0x80000000;
                        auVar34._0_8_ = 0x8000000080000000;
                        auVar34._12_4_ = 0x80000000;
                        auVar109 = vxorps_avx512vl(ZEXT416((uint)fVar190),auVar34);
                        auVar113 = ZEXT416((uint)(fVar186 * fVar190 * 4.0));
                        auVar108 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar113);
                        auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),
                                                   auVar113);
                        auVar225 = ZEXT464(0x3f000000);
                        fVar190 = fVar190 * auVar109._0_4_ * 0.5;
                        fVar184 = auVar108._0_4_ * 0.5;
                        fVar185 = auVar113._0_4_ * 0.5;
                        fVar186 = fVar186 * fVar186 * 0.5;
                        auVar219._0_4_ = fVar186 * fVar201;
                        auVar219._4_4_ = fVar186 * fVar166;
                        auVar219._8_4_ = fVar186 * fVar182;
                        auVar219._12_4_ = fVar186 * fVar183;
                        auVar168._4_4_ = fVar185;
                        auVar168._0_4_ = fVar185;
                        auVar168._8_4_ = fVar185;
                        auVar168._12_4_ = fVar185;
                        auVar113 = vfmadd132ps_fma(auVar168,auVar219,auVar6);
                        auVar212._4_4_ = fVar184;
                        auVar212._0_4_ = fVar184;
                        auVar212._8_4_ = fVar184;
                        auVar212._12_4_ = fVar184;
                        auVar113 = vfmadd132ps_fma(auVar212,auVar113,auVar29);
                        auVar169._4_4_ = fVar190;
                        auVar169._0_4_ = fVar190;
                        auVar169._8_4_ = fVar190;
                        auVar169._12_4_ = fVar190;
                        auVar113 = vfmadd213ps_fma(auVar169,auVar105,auVar113);
                        auVar241 = vbroadcastss_avx512f(auVar113);
                        auVar181 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar218 = vpermps_avx512f(auVar181,ZEXT1664(auVar113));
                        auVar221 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar221,ZEXT1664(auVar113));
                        local_2c0[0] = (RTCHitN)auVar241[0];
                        local_2c0[1] = (RTCHitN)auVar241[1];
                        local_2c0[2] = (RTCHitN)auVar241[2];
                        local_2c0[3] = (RTCHitN)auVar241[3];
                        local_2c0[4] = (RTCHitN)auVar241[4];
                        local_2c0[5] = (RTCHitN)auVar241[5];
                        local_2c0[6] = (RTCHitN)auVar241[6];
                        local_2c0[7] = (RTCHitN)auVar241[7];
                        local_2c0[8] = (RTCHitN)auVar241[8];
                        local_2c0[9] = (RTCHitN)auVar241[9];
                        local_2c0[10] = (RTCHitN)auVar241[10];
                        local_2c0[0xb] = (RTCHitN)auVar241[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar241[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar241[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar241[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar241[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar241[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar241[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar241[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar241[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar241[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar241[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar241[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar241[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar241[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar241[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar241[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar241[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar241[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar241[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar241[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar241[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar241[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar241[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar241[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar241[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar241[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar241[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar241[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar241[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar241[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar241[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar241[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar241[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar241[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar241[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar241[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar241[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar241[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar241[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar241[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar241[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar241[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar241[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar241[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar241[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar241[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar241[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar241[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar241[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar241[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar241[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar241[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar241[0x3f];
                        local_280 = auVar218;
                        local_180 = local_480._0_8_;
                        uStack_178 = local_480._8_8_;
                        uStack_170 = local_480._16_8_;
                        uStack_168 = local_480._24_8_;
                        uStack_160 = local_480._32_8_;
                        uStack_158 = local_480._40_8_;
                        uStack_150 = local_480._48_8_;
                        uStack_148 = local_480._56_8_;
                        auVar241 = vmovdqa64_avx512f(local_440);
                        local_140 = vmovdqa64_avx512f(auVar241);
                        auVar119 = vpcmpeqd_avx2(auVar241._0_32_,auVar241._0_32_);
                        local_7e8[3] = auVar119;
                        local_7e8[2] = auVar119;
                        local_7e8[1] = auVar119;
                        *local_7e8 = auVar119;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]))
                        ;
                        auVar241 = vmovdqa64_avx512f(local_300);
                        local_740 = vmovdqa64_avx512f(auVar241);
                        local_830.valid = (int *)local_740;
                        local_830.geometryUserPtr = pGVar11->userPtr;
                        local_830.hit = local_2c0;
                        local_830.N = 0x10;
                        local_780 = auVar239._0_32_;
                        local_800._0_4_ = (int)uVar102;
                        local_830.ray = (RTCRayN *)ray;
                        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar218 = ZEXT1664(auVar218._0_16_);
                          auVar221 = ZEXT1664(auVar221._0_16_);
                          auVar225 = ZEXT1664(auVar225._0_16_);
                          (*pGVar11->intersectionFilterN)(&local_830);
                          uVar102 = (ulong)(uint)local_800._0_4_;
                          auVar240 = ZEXT3264(local_7c0);
                          auVar239 = ZEXT3264(local_780);
                          auVar241 = vmovdqa64_avx512f(local_740);
                        }
                        bVar101 = (byte)uVar102;
                        uVar187 = vptestmd_avx512f(auVar241,auVar241);
                        if ((short)uVar187 == 0) {
LAB_01cc20b7:
                          *(int *)(ray + sVar100 * 4 + 0x200) = auVar239._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar218 = ZEXT1664(auVar218._0_16_);
                            auVar221 = ZEXT1664(auVar221._0_16_);
                            auVar225 = ZEXT1664(auVar225._0_16_);
                            (*p_Var12)(&local_830);
                            bVar101 = local_800[0];
                            auVar240 = ZEXT3264(local_7c0);
                            auVar239 = ZEXT3264(local_780);
                            auVar241 = vmovdqa64_avx512f(local_740);
                          }
                          uVar102 = vptestmd_avx512f(auVar241,auVar241);
                          if ((short)uVar102 == 0) goto LAB_01cc20b7;
                          iVar1 = *(int *)(local_830.hit + 4);
                          iVar2 = *(int *)(local_830.hit + 8);
                          iVar78 = *(int *)(local_830.hit + 0xc);
                          iVar79 = *(int *)(local_830.hit + 0x10);
                          iVar80 = *(int *)(local_830.hit + 0x14);
                          iVar81 = *(int *)(local_830.hit + 0x18);
                          iVar82 = *(int *)(local_830.hit + 0x1c);
                          iVar83 = *(int *)(local_830.hit + 0x20);
                          iVar84 = *(int *)(local_830.hit + 0x24);
                          iVar85 = *(int *)(local_830.hit + 0x28);
                          iVar86 = *(int *)(local_830.hit + 0x2c);
                          iVar87 = *(int *)(local_830.hit + 0x30);
                          iVar88 = *(int *)(local_830.hit + 0x34);
                          iVar89 = *(int *)(local_830.hit + 0x38);
                          iVar90 = *(int *)(local_830.hit + 0x3c);
                          bVar92 = (byte)uVar102;
                          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar102 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar102 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar102 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar102 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar102 >> 7) & 1);
                          bVar21 = (byte)(uVar102 >> 8);
                          bVar22 = (bool)((byte)(uVar102 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar102 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar102 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar102 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar102 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar102 >> 0xe) & 1);
                          bVar28 = SUB81(uVar102 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x300) =
                               (uint)(bVar92 & 1) * *(int *)local_830.hit |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 0x300);
                          *(uint *)(local_830.ray + 0x304) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x304);
                          *(uint *)(local_830.ray + 0x308) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x308);
                          *(uint *)(local_830.ray + 0x30c) =
                               (uint)bVar16 * iVar78 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x30c);
                          *(uint *)(local_830.ray + 0x310) =
                               (uint)bVar17 * iVar79 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x310);
                          *(uint *)(local_830.ray + 0x314) =
                               (uint)bVar18 * iVar80 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x314);
                          *(uint *)(local_830.ray + 0x318) =
                               (uint)bVar19 * iVar81 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x318);
                          *(uint *)(local_830.ray + 0x31c) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x31c);
                          *(uint *)(local_830.ray + 800) =
                               (uint)(bVar21 & 1) * iVar83 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 800);
                          *(uint *)(local_830.ray + 0x324) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x324);
                          *(uint *)(local_830.ray + 0x328) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x328);
                          *(uint *)(local_830.ray + 0x32c) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x32c);
                          *(uint *)(local_830.ray + 0x330) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x330);
                          *(uint *)(local_830.ray + 0x334) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x334);
                          *(uint *)(local_830.ray + 0x338) =
                               (uint)bVar27 * iVar89 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x338);
                          *(uint *)(local_830.ray + 0x33c) =
                               (uint)bVar28 * iVar90 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x33c);
                          iVar1 = *(int *)(local_830.hit + 0x44);
                          iVar2 = *(int *)(local_830.hit + 0x48);
                          iVar78 = *(int *)(local_830.hit + 0x4c);
                          iVar79 = *(int *)(local_830.hit + 0x50);
                          iVar80 = *(int *)(local_830.hit + 0x54);
                          iVar81 = *(int *)(local_830.hit + 0x58);
                          iVar82 = *(int *)(local_830.hit + 0x5c);
                          iVar83 = *(int *)(local_830.hit + 0x60);
                          iVar84 = *(int *)(local_830.hit + 100);
                          iVar85 = *(int *)(local_830.hit + 0x68);
                          iVar86 = *(int *)(local_830.hit + 0x6c);
                          iVar87 = *(int *)(local_830.hit + 0x70);
                          iVar88 = *(int *)(local_830.hit + 0x74);
                          iVar89 = *(int *)(local_830.hit + 0x78);
                          iVar90 = *(int *)(local_830.hit + 0x7c);
                          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar102 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar102 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar102 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar102 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar102 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar102 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar102 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar102 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar102 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar102 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar102 >> 0xe) & 1);
                          bVar28 = SUB81(uVar102 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x340) =
                               (uint)(bVar92 & 1) * *(int *)(local_830.hit + 0x40) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 0x340);
                          *(uint *)(local_830.ray + 0x344) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x344);
                          *(uint *)(local_830.ray + 0x348) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x348);
                          *(uint *)(local_830.ray + 0x34c) =
                               (uint)bVar16 * iVar78 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x34c);
                          *(uint *)(local_830.ray + 0x350) =
                               (uint)bVar17 * iVar79 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x350);
                          *(uint *)(local_830.ray + 0x354) =
                               (uint)bVar18 * iVar80 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x354);
                          *(uint *)(local_830.ray + 0x358) =
                               (uint)bVar19 * iVar81 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x358);
                          *(uint *)(local_830.ray + 0x35c) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x35c);
                          *(uint *)(local_830.ray + 0x360) =
                               (uint)(bVar21 & 1) * iVar83 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 0x360);
                          *(uint *)(local_830.ray + 0x364) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x364);
                          *(uint *)(local_830.ray + 0x368) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x368);
                          *(uint *)(local_830.ray + 0x36c) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x36c);
                          *(uint *)(local_830.ray + 0x370) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x370);
                          *(uint *)(local_830.ray + 0x374) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x374);
                          *(uint *)(local_830.ray + 0x378) =
                               (uint)bVar27 * iVar89 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x378);
                          *(uint *)(local_830.ray + 0x37c) =
                               (uint)bVar28 * iVar90 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x37c);
                          iVar1 = *(int *)(local_830.hit + 0x84);
                          iVar2 = *(int *)(local_830.hit + 0x88);
                          iVar78 = *(int *)(local_830.hit + 0x8c);
                          iVar79 = *(int *)(local_830.hit + 0x90);
                          iVar80 = *(int *)(local_830.hit + 0x94);
                          iVar81 = *(int *)(local_830.hit + 0x98);
                          iVar82 = *(int *)(local_830.hit + 0x9c);
                          iVar83 = *(int *)(local_830.hit + 0xa0);
                          iVar84 = *(int *)(local_830.hit + 0xa4);
                          iVar85 = *(int *)(local_830.hit + 0xa8);
                          iVar86 = *(int *)(local_830.hit + 0xac);
                          iVar87 = *(int *)(local_830.hit + 0xb0);
                          iVar88 = *(int *)(local_830.hit + 0xb4);
                          iVar89 = *(int *)(local_830.hit + 0xb8);
                          iVar90 = *(int *)(local_830.hit + 0xbc);
                          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar102 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar102 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar102 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar102 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar102 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar102 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar102 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar102 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar102 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar102 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar102 >> 0xe) & 1);
                          bVar28 = SUB81(uVar102 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x380) =
                               (uint)(bVar92 & 1) * *(int *)(local_830.hit + 0x80) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 0x380);
                          *(uint *)(local_830.ray + 900) =
                               (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 900);
                          *(uint *)(local_830.ray + 0x388) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x388);
                          *(uint *)(local_830.ray + 0x38c) =
                               (uint)bVar16 * iVar78 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x38c);
                          *(uint *)(local_830.ray + 0x390) =
                               (uint)bVar17 * iVar79 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x390);
                          *(uint *)(local_830.ray + 0x394) =
                               (uint)bVar18 * iVar80 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x394);
                          *(uint *)(local_830.ray + 0x398) =
                               (uint)bVar19 * iVar81 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x398);
                          *(uint *)(local_830.ray + 0x39c) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x39c);
                          *(uint *)(local_830.ray + 0x3a0) =
                               (uint)(bVar21 & 1) * iVar83 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 0x3a0);
                          *(uint *)(local_830.ray + 0x3a4) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3a4);
                          *(uint *)(local_830.ray + 0x3a8) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3a8);
                          *(uint *)(local_830.ray + 0x3ac) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3ac);
                          *(uint *)(local_830.ray + 0x3b0) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3b0);
                          *(uint *)(local_830.ray + 0x3b4) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3b4);
                          *(uint *)(local_830.ray + 0x3b8) =
                               (uint)bVar27 * iVar89 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x3b8);
                          *(uint *)(local_830.ray + 0x3bc) =
                               (uint)bVar28 * iVar90 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x3bc);
                          iVar1 = *(int *)(local_830.hit + 0xc4);
                          iVar2 = *(int *)(local_830.hit + 200);
                          iVar78 = *(int *)(local_830.hit + 0xcc);
                          iVar79 = *(int *)(local_830.hit + 0xd0);
                          iVar80 = *(int *)(local_830.hit + 0xd4);
                          iVar81 = *(int *)(local_830.hit + 0xd8);
                          iVar82 = *(int *)(local_830.hit + 0xdc);
                          iVar83 = *(int *)(local_830.hit + 0xe0);
                          iVar84 = *(int *)(local_830.hit + 0xe4);
                          iVar85 = *(int *)(local_830.hit + 0xe8);
                          iVar86 = *(int *)(local_830.hit + 0xec);
                          iVar87 = *(int *)(local_830.hit + 0xf0);
                          iVar88 = *(int *)(local_830.hit + 0xf4);
                          iVar89 = *(int *)(local_830.hit + 0xf8);
                          iVar90 = *(int *)(local_830.hit + 0xfc);
                          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar102 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar102 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar102 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar102 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar102 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar102 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar102 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar102 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar102 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar102 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar102 >> 0xe) & 1);
                          bVar28 = SUB81(uVar102 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x3c0) =
                               (uint)(bVar92 & 1) * *(int *)(local_830.hit + 0xc0) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 0x3c0);
                          *(uint *)(local_830.ray + 0x3c4) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x3c4);
                          *(uint *)(local_830.ray + 0x3c8) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x3c8);
                          *(uint *)(local_830.ray + 0x3cc) =
                               (uint)bVar16 * iVar78 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x3cc);
                          *(uint *)(local_830.ray + 0x3d0) =
                               (uint)bVar17 * iVar79 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x3d0);
                          *(uint *)(local_830.ray + 0x3d4) =
                               (uint)bVar18 * iVar80 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x3d4);
                          *(uint *)(local_830.ray + 0x3d8) =
                               (uint)bVar19 * iVar81 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x3d8);
                          *(uint *)(local_830.ray + 0x3dc) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x3dc);
                          *(uint *)(local_830.ray + 0x3e0) =
                               (uint)(bVar21 & 1) * iVar83 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 0x3e0);
                          *(uint *)(local_830.ray + 0x3e4) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3e4);
                          *(uint *)(local_830.ray + 1000) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 1000);
                          *(uint *)(local_830.ray + 0x3ec) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3ec);
                          *(uint *)(local_830.ray + 0x3f0) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3f0);
                          *(uint *)(local_830.ray + 0x3f4) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3f4);
                          *(uint *)(local_830.ray + 0x3f8) =
                               (uint)bVar27 * iVar89 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x3f8);
                          *(uint *)(local_830.ray + 0x3fc) =
                               (uint)bVar28 * iVar90 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x3fc);
                          iVar1 = *(int *)(local_830.hit + 0x104);
                          iVar2 = *(int *)(local_830.hit + 0x108);
                          iVar78 = *(int *)(local_830.hit + 0x10c);
                          iVar79 = *(int *)(local_830.hit + 0x110);
                          iVar80 = *(int *)(local_830.hit + 0x114);
                          iVar81 = *(int *)(local_830.hit + 0x118);
                          iVar82 = *(int *)(local_830.hit + 0x11c);
                          iVar83 = *(int *)(local_830.hit + 0x120);
                          iVar84 = *(int *)(local_830.hit + 0x124);
                          iVar85 = *(int *)(local_830.hit + 0x128);
                          iVar86 = *(int *)(local_830.hit + 300);
                          iVar87 = *(int *)(local_830.hit + 0x130);
                          iVar88 = *(int *)(local_830.hit + 0x134);
                          iVar89 = *(int *)(local_830.hit + 0x138);
                          iVar90 = *(int *)(local_830.hit + 0x13c);
                          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar102 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar102 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar102 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar102 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar102 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar102 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar102 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar102 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar102 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar102 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar102 >> 0xe) & 1);
                          bVar28 = SUB81(uVar102 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x400) =
                               (uint)(bVar92 & 1) * *(int *)(local_830.hit + 0x100) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_830.ray + 0x400);
                          *(uint *)(local_830.ray + 0x404) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x404);
                          *(uint *)(local_830.ray + 0x408) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x408);
                          *(uint *)(local_830.ray + 0x40c) =
                               (uint)bVar16 * iVar78 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x40c);
                          *(uint *)(local_830.ray + 0x410) =
                               (uint)bVar17 * iVar79 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x410);
                          *(uint *)(local_830.ray + 0x414) =
                               (uint)bVar18 * iVar80 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x414);
                          *(uint *)(local_830.ray + 0x418) =
                               (uint)bVar19 * iVar81 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x418);
                          *(uint *)(local_830.ray + 0x41c) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x41c);
                          *(uint *)(local_830.ray + 0x420) =
                               (uint)(bVar21 & 1) * iVar83 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 0x420);
                          *(uint *)(local_830.ray + 0x424) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x424);
                          *(uint *)(local_830.ray + 0x428) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x428);
                          *(uint *)(local_830.ray + 0x42c) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x42c);
                          *(uint *)(local_830.ray + 0x430) =
                               (uint)bVar25 * iVar87 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x430);
                          *(uint *)(local_830.ray + 0x434) =
                               (uint)bVar26 * iVar88 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x434);
                          *(uint *)(local_830.ray + 0x438) =
                               (uint)bVar27 * iVar89 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x438);
                          *(uint *)(local_830.ray + 0x43c) =
                               (uint)bVar28 * iVar90 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x43c);
                          auVar241 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140)
                                                      );
                          auVar241 = vmovdqu32_avx512f(auVar241);
                          *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar241;
                          auVar241 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180)
                                                      );
                          auVar241 = vmovdqu32_avx512f(auVar241);
                          *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar241;
                          auVar241 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0)
                                                      );
                          auVar241 = vmovdqa32_avx512f(auVar241);
                          *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar241;
                          auVar241 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200)
                                                      );
                          auVar241 = vmovdqa32_avx512f(auVar241);
                          *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar241;
                          auVar239 = ZEXT464(*(uint *)(ray + sVar100 * 4 + 0x200));
                        }
                        bVar101 = ~(byte)(1 << ((uint)uVar93 & 0x1f)) & bVar101;
                        uVar167 = auVar239._0_4_;
                        auVar177._4_4_ = uVar167;
                        auVar177._0_4_ = uVar167;
                        auVar177._8_4_ = uVar167;
                        auVar177._12_4_ = uVar167;
                        auVar177._16_4_ = uVar167;
                        auVar177._20_4_ = uVar167;
                        auVar177._24_4_ = uVar167;
                        auVar177._28_4_ = uVar167;
                        uVar187 = vcmpps_avx512vl(auVar240._0_32_,auVar177,2);
                        if ((bVar101 & (byte)uVar187) == 0) goto LAB_01cc2147;
                        bVar101 = bVar101 & (byte)uVar187;
                        uVar102 = (ulong)bVar101;
                        auVar178._8_4_ = 0x7f800000;
                        auVar178._0_8_ = 0x7f8000007f800000;
                        auVar178._12_4_ = 0x7f800000;
                        auVar178._16_4_ = 0x7f800000;
                        auVar178._20_4_ = 0x7f800000;
                        auVar178._24_4_ = 0x7f800000;
                        auVar178._28_4_ = 0x7f800000;
                        auVar119 = vblendmps_avx512vl(auVar178,auVar240._0_32_);
                        auVar154._0_4_ =
                             (uint)(bVar101 & 1) * auVar119._0_4_ |
                             (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 1 & 1);
                        auVar154._4_4_ = (uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 2 & 1);
                        auVar154._8_4_ = (uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 3 & 1);
                        auVar154._12_4_ =
                             (uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 4 & 1);
                        auVar154._16_4_ =
                             (uint)bVar14 * auVar119._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 5 & 1);
                        auVar154._20_4_ =
                             (uint)bVar14 * auVar119._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar101 >> 6 & 1);
                        auVar154._24_4_ =
                             (uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar154._28_4_ =
                             (uint)(bVar101 >> 7) * auVar119._28_4_ |
                             (uint)!(bool)(bVar101 >> 7) * 0x7f800000;
                        auVar119 = vshufps_avx(auVar154,auVar154,0xb1);
                        auVar119 = vminps_avx(auVar154,auVar119);
                        auVar117 = vshufpd_avx(auVar119,auVar119,5);
                        auVar119 = vminps_avx(auVar119,auVar117);
                        auVar117 = vpermpd_avx2(auVar119,0x4e);
                        auVar119 = vminps_avx(auVar119,auVar117);
                        uVar187 = vcmpps_avx512vl(auVar154,auVar119,0);
                        bVar92 = (byte)uVar187 & bVar101;
                        if (bVar92 != 0) {
                          bVar101 = bVar92;
                        }
                        uVar94 = 0;
                        for (uVar95 = (uint)bVar101; (uVar95 & 1) == 0;
                            uVar95 = uVar95 >> 1 | 0x80000000) {
                          uVar94 = uVar94 + 1;
                        }
                        uVar93 = (ulong)uVar94;
                      } while( true );
                    }
                    fVar190 = local_540[uVar93];
                    uVar167 = *(undefined4 *)(local_520 + uVar93 * 4);
                    fVar184 = 1.0 - fVar190;
                    auVar33._8_4_ = 0x80000000;
                    auVar33._0_8_ = 0x8000000080000000;
                    auVar33._12_4_ = 0x80000000;
                    auVar109 = vxorps_avx512vl(ZEXT416((uint)fVar184),auVar33);
                    auVar113 = ZEXT416((uint)(fVar190 * fVar184 * 4.0));
                    auVar108 = vfnmsub213ss_fma(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),
                                                auVar113);
                    auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),
                                               auVar113);
                    fVar184 = fVar184 * auVar109._0_4_ * 0.5;
                    fVar185 = auVar108._0_4_ * 0.5;
                    auVar221 = ZEXT464((uint)fVar185);
                    fVar186 = auVar113._0_4_ * 0.5;
                    fVar200 = fVar190 * fVar190 * 0.5;
                    auVar210._0_4_ = fVar200 * fVar201;
                    auVar210._4_4_ = fVar200 * fVar166;
                    auVar210._8_4_ = fVar200 * fVar182;
                    auVar210._12_4_ = fVar200 * fVar183;
                    auVar195._4_4_ = fVar186;
                    auVar195._0_4_ = fVar186;
                    auVar195._8_4_ = fVar186;
                    auVar195._12_4_ = fVar186;
                    auVar113 = vfmadd132ps_fma(auVar195,auVar210,auVar6);
                    auVar211._4_4_ = fVar185;
                    auVar211._0_4_ = fVar185;
                    auVar211._8_4_ = fVar185;
                    auVar211._12_4_ = fVar185;
                    auVar113 = vfmadd132ps_fma(auVar211,auVar113,auVar29);
                    auVar218 = ZEXT1664(auVar113);
                    auVar196._4_4_ = fVar184;
                    auVar196._0_4_ = fVar184;
                    auVar196._8_4_ = fVar184;
                    auVar196._12_4_ = fVar184;
                    auVar113 = vfmadd213ps_fma(auVar196,auVar105,auVar113);
                    *(undefined4 *)(ray + sVar100 * 4 + 0x200) =
                         *(undefined4 *)(local_500 + uVar93 * 4);
                    *(int *)(ray + sVar100 * 4 + 0x300) = auVar113._0_4_;
                    uVar10 = vextractps_avx(auVar113,1);
                    *(undefined4 *)(ray + sVar100 * 4 + 0x340) = uVar10;
                    uVar10 = vextractps_avx(auVar113,2);
                    *(undefined4 *)(ray + sVar100 * 4 + 0x380) = uVar10;
                    *(float *)(ray + sVar100 * 4 + 0x3c0) = fVar190;
                    *(undefined4 *)(ray + sVar100 * 4 + 0x400) = uVar167;
                    *(undefined4 *)(ray + sVar100 * 4 + 0x440) = uVar3;
                    *(uint *)(ray + sVar100 * 4 + 0x480) = uVar98;
                    *(uint *)(ray + sVar100 * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + sVar100 * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01cc1d5f;
      }
LAB_01cc13be:
      uVar3 = *(undefined4 *)(ray + sVar100 * 4 + 0x200);
      auVar39._4_4_ = uVar3;
      auVar39._0_4_ = uVar3;
      auVar39._8_4_ = uVar3;
      auVar39._12_4_ = uVar3;
      auVar39._16_4_ = uVar3;
      auVar39._20_4_ = uVar3;
      auVar39._24_4_ = uVar3;
      auVar39._28_4_ = uVar3;
      uVar187 = vcmpps_avx512vl(local_320,auVar39,2);
      uVar98 = (uint)uVar99 & (uint)uVar187;
      uVar99 = (ulong)uVar98;
    } while (uVar98 != 0);
  }
  return;
LAB_01cc2147:
  auVar119 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar241 = ZEXT3264(auVar119);
  auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar181 = ZEXT1664(auVar113);
  auVar242 = ZEXT464(0x35000000);
  auVar119 = vmovdqa64_avx512vl(local_3e0);
  auVar229 = ZEXT3264(auVar119);
LAB_01cc1d5f:
  lVar97 = lVar97 + 8;
  if (iVar9 <= (int)lVar97) goto LAB_01cc13be;
  goto LAB_01cc1463;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }